

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [60];
  undefined1 auVar65 [60];
  undefined1 auVar66 [12];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  ulong uVar92;
  ulong uVar93;
  uint uVar94;
  byte bVar95;
  byte bVar96;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  Primitive *pPVar97;
  uint uVar98;
  long lVar99;
  bool bVar100;
  ulong uVar101;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  uint uVar170;
  uint uVar171;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  uint uVar172;
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  float pp;
  float fVar173;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar193 [32];
  float fVar197;
  undefined1 auVar194 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar198;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar237;
  float fVar238;
  undefined4 uVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  float fVar259;
  float fVar261;
  undefined1 auVar255 [16];
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar256 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  float fVar267;
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [16];
  undefined1 (*local_ad0) [32];
  Primitive *local_ac8;
  Primitive *local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  uint auStack_158 [74];
  undefined1 auVar161 [64];
  undefined1 auVar165 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar3 = prim[1];
  uVar93 = (ulong)(byte)PVar3;
  lVar99 = uVar93 * 0x19;
  fVar238 = *(float *)(prim + lVar99 + 0x12);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar109 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar110 = vsubps_avx(auVar104,*(undefined1 (*) [16])(prim + lVar99 + 6));
  fVar237 = fVar238 * auVar110._0_4_;
  fVar173 = fVar238 * auVar109._0_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar118 = vpmovsxbd_avx2(auVar104);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar21);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar119 = vpmovsxbd_avx2(auVar105);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar93 * 0xb + 6);
  auVar120 = vpmovsxbd_avx2(auVar106);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar125 = vpmovsxbd_avx2(auVar102);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar121 = vcvtdq2ps_avx(auVar125);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar93 + 6);
  auVar117 = vpmovsxbd_avx2(auVar107);
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar101 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar122 = vpmovsxbd_avx2(auVar2);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar101 + uVar93 + 6);
  auVar123 = vpmovsxbd_avx2(auVar103);
  auVar123 = vcvtdq2ps_avx(auVar123);
  uVar92 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar115 = vpmovsxbd_avx2(auVar108);
  auVar124 = vcvtdq2ps_avx(auVar115);
  auVar135._4_4_ = fVar173;
  auVar135._0_4_ = fVar173;
  auVar135._8_4_ = fVar173;
  auVar135._12_4_ = fVar173;
  auVar135._16_4_ = fVar173;
  auVar135._20_4_ = fVar173;
  auVar135._24_4_ = fVar173;
  auVar135._28_4_ = fVar173;
  auVar137._8_4_ = 1;
  auVar137._0_8_ = 0x100000001;
  auVar137._12_4_ = 1;
  auVar137._16_4_ = 1;
  auVar137._20_4_ = 1;
  auVar137._24_4_ = 1;
  auVar137._28_4_ = 1;
  auVar113 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar127 = ZEXT1632(CONCAT412(fVar238 * auVar109._12_4_,
                                CONCAT48(fVar238 * auVar109._8_4_,
                                         CONCAT44(fVar238 * auVar109._4_4_,fVar173))));
  auVar126 = vpermps_avx2(auVar137,auVar127);
  auVar114 = vpermps_avx512vl(auVar113,auVar127);
  fVar173 = auVar114._0_4_;
  fVar257 = auVar114._4_4_;
  auVar127._4_4_ = fVar257 * auVar119._4_4_;
  auVar127._0_4_ = fVar173 * auVar119._0_4_;
  fVar258 = auVar114._8_4_;
  auVar127._8_4_ = fVar258 * auVar119._8_4_;
  fVar260 = auVar114._12_4_;
  auVar127._12_4_ = fVar260 * auVar119._12_4_;
  fVar267 = auVar114._16_4_;
  auVar127._16_4_ = fVar267 * auVar119._16_4_;
  fVar197 = auVar114._20_4_;
  auVar127._20_4_ = fVar197 * auVar119._20_4_;
  fVar262 = auVar114._24_4_;
  auVar127._24_4_ = fVar262 * auVar119._24_4_;
  auVar127._28_4_ = auVar125._28_4_;
  auVar125._4_4_ = auVar117._4_4_ * fVar257;
  auVar125._0_4_ = auVar117._0_4_ * fVar173;
  auVar125._8_4_ = auVar117._8_4_ * fVar258;
  auVar125._12_4_ = auVar117._12_4_ * fVar260;
  auVar125._16_4_ = auVar117._16_4_ * fVar267;
  auVar125._20_4_ = auVar117._20_4_ * fVar197;
  auVar125._24_4_ = auVar117._24_4_ * fVar262;
  auVar125._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = auVar124._4_4_ * fVar257;
  auVar115._0_4_ = auVar124._0_4_ * fVar173;
  auVar115._8_4_ = auVar124._8_4_ * fVar258;
  auVar115._12_4_ = auVar124._12_4_ * fVar260;
  auVar115._16_4_ = auVar124._16_4_ * fVar267;
  auVar115._20_4_ = auVar124._20_4_ * fVar197;
  auVar115._24_4_ = auVar124._24_4_ * fVar262;
  auVar115._28_4_ = auVar114._28_4_;
  auVar104 = vfmadd231ps_fma(auVar127,auVar126,auVar116);
  auVar21 = vfmadd231ps_fma(auVar125,auVar126,auVar121);
  auVar105 = vfmadd231ps_fma(auVar115,auVar123,auVar126);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar135,auVar118);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar135,auVar120);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar122,auVar135);
  auVar136._4_4_ = fVar237;
  auVar136._0_4_ = fVar237;
  auVar136._8_4_ = fVar237;
  auVar136._12_4_ = fVar237;
  auVar136._16_4_ = fVar237;
  auVar136._20_4_ = fVar237;
  auVar136._24_4_ = fVar237;
  auVar136._28_4_ = fVar237;
  auVar115 = ZEXT1632(CONCAT412(fVar238 * auVar110._12_4_,
                                CONCAT48(fVar238 * auVar110._8_4_,
                                         CONCAT44(fVar238 * auVar110._4_4_,fVar237))));
  auVar125 = vpermps_avx2(auVar137,auVar115);
  auVar115 = vpermps_avx512vl(auVar113,auVar115);
  fVar238 = auVar115._0_4_;
  fVar173 = auVar115._4_4_;
  auVar126._4_4_ = fVar173 * auVar119._4_4_;
  auVar126._0_4_ = fVar238 * auVar119._0_4_;
  fVar257 = auVar115._8_4_;
  auVar126._8_4_ = fVar257 * auVar119._8_4_;
  fVar258 = auVar115._12_4_;
  auVar126._12_4_ = fVar258 * auVar119._12_4_;
  fVar260 = auVar115._16_4_;
  auVar126._16_4_ = fVar260 * auVar119._16_4_;
  fVar267 = auVar115._20_4_;
  auVar126._20_4_ = fVar267 * auVar119._20_4_;
  fVar197 = auVar115._24_4_;
  auVar126._24_4_ = fVar197 * auVar119._24_4_;
  auVar126._28_4_ = 1;
  auVar113._4_4_ = auVar117._4_4_ * fVar173;
  auVar113._0_4_ = auVar117._0_4_ * fVar238;
  auVar113._8_4_ = auVar117._8_4_ * fVar257;
  auVar113._12_4_ = auVar117._12_4_ * fVar258;
  auVar113._16_4_ = auVar117._16_4_ * fVar260;
  auVar113._20_4_ = auVar117._20_4_ * fVar267;
  auVar113._24_4_ = auVar117._24_4_ * fVar197;
  auVar113._28_4_ = auVar119._28_4_;
  auVar117._4_4_ = auVar124._4_4_ * fVar173;
  auVar117._0_4_ = auVar124._0_4_ * fVar238;
  auVar117._8_4_ = auVar124._8_4_ * fVar257;
  auVar117._12_4_ = auVar124._12_4_ * fVar258;
  auVar117._16_4_ = auVar124._16_4_ * fVar260;
  auVar117._20_4_ = auVar124._20_4_ * fVar267;
  auVar117._24_4_ = auVar124._24_4_ * fVar197;
  auVar117._28_4_ = auVar115._28_4_;
  auVar106 = vfmadd231ps_fma(auVar126,auVar125,auVar116);
  auVar102 = vfmadd231ps_fma(auVar113,auVar125,auVar121);
  auVar107 = vfmadd231ps_fma(auVar117,auVar125,auVar123);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar136,auVar118);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar136,auVar120);
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar136,auVar122);
  auVar118 = vandps_avx(ZEXT1632(auVar104),auVar132);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar134._16_4_ = 0x219392ef;
  auVar134._20_4_ = 0x219392ef;
  auVar134._24_4_ = 0x219392ef;
  auVar134._28_4_ = 0x219392ef;
  uVar101 = vcmpps_avx512vl(auVar118,auVar134,1);
  bVar7 = (bool)((byte)uVar101 & 1);
  auVar114._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._0_4_;
  bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._4_4_;
  bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._8_4_;
  bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar21),auVar132);
  uVar101 = vcmpps_avx512vl(auVar118,auVar134,1);
  bVar7 = (bool)((byte)uVar101 & 1);
  auVar128._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._0_4_;
  bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar128._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._4_4_;
  bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar128._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._8_4_;
  bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar128._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._12_4_;
  auVar128._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar128._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar128._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar128._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar105),auVar132);
  uVar101 = vcmpps_avx512vl(auVar118,auVar134,1);
  bVar7 = (bool)((byte)uVar101 & 1);
  auVar118._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar105._0_4_;
  bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar105._4_4_;
  bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar105._8_4_;
  bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar105._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar114);
  auVar133._8_4_ = 0x3f800000;
  auVar133._0_8_ = &DAT_3f8000003f800000;
  auVar133._12_4_ = 0x3f800000;
  auVar133._16_4_ = 0x3f800000;
  auVar133._20_4_ = 0x3f800000;
  auVar133._24_4_ = 0x3f800000;
  auVar133._28_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_fma(auVar114,auVar116,auVar133);
  auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar128);
  auVar21 = vfnmadd213ps_fma(auVar128,auVar116,auVar133);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar118);
  auVar105 = vfnmadd213ps_fma(auVar118,auVar116,auVar133);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar116,auVar116);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar106));
  auVar122._4_4_ = auVar104._4_4_ * auVar118._4_4_;
  auVar122._0_4_ = auVar104._0_4_ * auVar118._0_4_;
  auVar122._8_4_ = auVar104._8_4_ * auVar118._8_4_;
  auVar122._12_4_ = auVar104._12_4_ * auVar118._12_4_;
  auVar122._16_4_ = auVar118._16_4_ * 0.0;
  auVar122._20_4_ = auVar118._20_4_ * 0.0;
  auVar122._24_4_ = auVar118._24_4_ * 0.0;
  auVar122._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar106));
  auVar117 = vpbroadcastd_avx512vl();
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar131._0_4_ = auVar104._0_4_ * auVar118._0_4_;
  auVar131._4_4_ = auVar104._4_4_ * auVar118._4_4_;
  auVar131._8_4_ = auVar104._8_4_ * auVar118._8_4_;
  auVar131._12_4_ = auVar104._12_4_ * auVar118._12_4_;
  auVar131._16_4_ = auVar118._16_4_ * 0.0;
  auVar131._20_4_ = auVar118._20_4_ * 0.0;
  auVar131._24_4_ = auVar118._24_4_ * 0.0;
  auVar131._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar3 * 0x10 + uVar93 * -2 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar102));
  auVar123._4_4_ = auVar21._4_4_ * auVar118._4_4_;
  auVar123._0_4_ = auVar21._0_4_ * auVar118._0_4_;
  auVar123._8_4_ = auVar21._8_4_ * auVar118._8_4_;
  auVar123._12_4_ = auVar21._12_4_ * auVar118._12_4_;
  auVar123._16_4_ = auVar118._16_4_ * 0.0;
  auVar123._20_4_ = auVar118._20_4_ * 0.0;
  auVar123._24_4_ = auVar118._24_4_ * 0.0;
  auVar123._28_4_ = auVar118._28_4_;
  auVar118 = vcvtdq2ps_avx(auVar116);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar102));
  auVar130._0_4_ = auVar21._0_4_ * auVar118._0_4_;
  auVar130._4_4_ = auVar21._4_4_ * auVar118._4_4_;
  auVar130._8_4_ = auVar21._8_4_ * auVar118._8_4_;
  auVar130._12_4_ = auVar21._12_4_ * auVar118._12_4_;
  auVar130._16_4_ = auVar118._16_4_ * 0.0;
  auVar130._20_4_ = auVar118._20_4_ * 0.0;
  auVar130._24_4_ = auVar118._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 + uVar93 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar107));
  auVar124._4_4_ = auVar118._4_4_ * auVar105._4_4_;
  auVar124._0_4_ = auVar118._0_4_ * auVar105._0_4_;
  auVar124._8_4_ = auVar118._8_4_ * auVar105._8_4_;
  auVar124._12_4_ = auVar118._12_4_ * auVar105._12_4_;
  auVar124._16_4_ = auVar118._16_4_ * 0.0;
  auVar124._20_4_ = auVar118._20_4_ * 0.0;
  auVar124._24_4_ = auVar118._24_4_ * 0.0;
  auVar124._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x17 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar107));
  auVar129._0_4_ = auVar105._0_4_ * auVar118._0_4_;
  auVar129._4_4_ = auVar105._4_4_ * auVar118._4_4_;
  auVar129._8_4_ = auVar105._8_4_ * auVar118._8_4_;
  auVar129._12_4_ = auVar105._12_4_ * auVar118._12_4_;
  auVar129._16_4_ = auVar118._16_4_ * 0.0;
  auVar129._20_4_ = auVar118._20_4_ * 0.0;
  auVar129._24_4_ = auVar118._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar118 = vpminsd_avx2(auVar122,auVar131);
  auVar116 = vpminsd_avx2(auVar123,auVar130);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116 = vpminsd_avx2(auVar124,auVar129);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar119._16_4_ = uVar1;
  auVar119._20_4_ = uVar1;
  auVar119._24_4_ = uVar1;
  auVar119._28_4_ = uVar1;
  auVar116 = vmaxps_avx512vl(auVar116,auVar119);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar118,auVar116);
  auVar118 = vpmaxsd_avx2(auVar122,auVar131);
  auVar116 = vpmaxsd_avx2(auVar123,auVar130);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar116 = vpmaxsd_avx2(auVar124,auVar129);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar120._4_4_ = uVar1;
  auVar120._0_4_ = uVar1;
  auVar120._8_4_ = uVar1;
  auVar120._12_4_ = uVar1;
  auVar120._16_4_ = uVar1;
  auVar120._20_4_ = uVar1;
  auVar120._24_4_ = uVar1;
  auVar120._28_4_ = uVar1;
  auVar116 = vminps_avx512vl(auVar116,auVar120);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar121._8_4_ = 0x3f800003;
  auVar121._0_8_ = 0x3f8000033f800003;
  auVar121._12_4_ = 0x3f800003;
  auVar121._16_4_ = 0x3f800003;
  auVar121._20_4_ = 0x3f800003;
  auVar121._24_4_ = 0x3f800003;
  auVar121._28_4_ = 0x3f800003;
  auVar118 = vmulps_avx512vl(auVar118,auVar121);
  uVar25 = vpcmpgtd_avx512vl(auVar117,_DAT_0205a920);
  uVar23 = vcmpps_avx512vl(local_760,auVar118,2);
  if ((byte)((byte)uVar23 & (byte)uVar25) == 0) {
    return;
  }
  local_aa8 = (ulong)(byte)((byte)uVar23 & (byte)uVar25);
  pPVar97 = prim + lVar99 + 0x16;
  local_ad0 = (undefined1 (*) [32])local_240;
  auVar194 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar194);
  local_ac8 = pPVar97;
  local_ac0 = prim;
LAB_01d11946:
  lVar99 = 0;
  for (uVar101 = local_aa8; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
    lVar99 = lVar99 + 1;
  }
  local_aa8 = local_aa8 - 1 & local_aa8;
  uVar1 = *(undefined4 *)(prim + lVar99 * 4 + 6);
  uVar101 = (ulong)(uint)((int)lVar99 << 6);
  auVar104 = *(undefined1 (*) [16])(pPVar97 + uVar101);
  if (local_aa8 != 0) {
    uVar93 = local_aa8 - 1 & local_aa8;
    for (uVar92 = local_aa8; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
    }
    if (uVar93 != 0) {
      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar21 = *(undefined1 (*) [16])(pPVar97 + uVar101 + 0x10);
  auVar105 = *(undefined1 (*) [16])(pPVar97 + uVar101 + 0x20);
  auVar106 = *(undefined1 (*) [16])(pPVar97 + uVar101 + 0x30);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar107 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar118 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar158._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar102 = vunpcklps_avx512vl(auVar118._0_16_,auVar158._0_16_);
  auVar194._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar273 = ZEXT3264(auVar194._0_32_);
  auVar108 = auVar194._0_16_;
  local_a20 = vinsertps_avx512f(auVar102,auVar108,0x28);
  auVar110._0_4_ = auVar104._0_4_ + auVar21._0_4_ + auVar105._0_4_ + auVar106._0_4_;
  auVar110._4_4_ = auVar104._4_4_ + auVar21._4_4_ + auVar105._4_4_ + auVar106._4_4_;
  auVar110._8_4_ = auVar104._8_4_ + auVar21._8_4_ + auVar105._8_4_ + auVar106._8_4_;
  auVar110._12_4_ = auVar104._12_4_ + auVar21._12_4_ + auVar105._12_4_ + auVar106._12_4_;
  auVar109._8_4_ = 0x3e800000;
  auVar109._0_8_ = 0x3e8000003e800000;
  auVar109._12_4_ = 0x3e800000;
  auVar102 = vmulps_avx512vl(auVar110,auVar109);
  auVar102 = vsubps_avx(auVar102,auVar107);
  auVar102 = vdpps_avx(auVar102,local_a20,0x7f);
  fVar238 = *(float *)(ray + k * 4 + 0xc0);
  local_a30 = vdpps_avx(local_a20,local_a20,0x7f);
  uVar98 = *(uint *)(prim + 2);
  auVar112._4_12_ = ZEXT812(0) << 0x20;
  auVar112._0_4_ = local_a30._0_4_;
  auVar103 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar112);
  auVar2 = vfnmadd213ss_fma(auVar103,local_a30,ZEXT416(0x40000000));
  local_740 = auVar102._0_4_ * auVar103._0_4_ * auVar2._0_4_;
  auVar111._4_4_ = local_740;
  auVar111._0_4_ = local_740;
  auVar111._8_4_ = local_740;
  auVar111._12_4_ = local_740;
  fStack_8f0 = local_740;
  _local_900 = auVar111;
  fStack_8ec = local_740;
  fStack_8e8 = local_740;
  fStack_8e4 = local_740;
  auVar102 = vfmadd231ps_fma(auVar107,local_a20,auVar111);
  auVar102 = vblendps_avx(auVar102,ZEXT816(0) << 0x40,8);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar105 = vsubps_avx(auVar105,auVar102);
  auVar21 = vsubps_avx(auVar21,auVar102);
  auVar106 = vsubps_avx(auVar106,auVar102);
  local_520 = auVar104._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar139._8_4_ = 1;
  auVar139._0_8_ = 0x100000001;
  auVar139._12_4_ = 1;
  auVar139._16_4_ = 1;
  auVar139._20_4_ = 1;
  auVar139._24_4_ = 1;
  auVar139._28_4_ = 1;
  local_940 = ZEXT1632(auVar104);
  local_540 = vpermps_avx2(auVar139,local_940);
  auVar140._8_4_ = 2;
  auVar140._0_8_ = 0x200000002;
  auVar140._12_4_ = 2;
  auVar140._16_4_ = 2;
  auVar140._20_4_ = 2;
  auVar140._24_4_ = 2;
  auVar140._28_4_ = 2;
  local_560 = vpermps_avx2(auVar140,local_940);
  auVar143._8_4_ = 3;
  auVar143._0_8_ = 0x300000003;
  auVar143._12_4_ = 3;
  auVar143._16_4_ = 3;
  auVar143._20_4_ = 3;
  auVar143._24_4_ = 3;
  auVar143._28_4_ = 3;
  local_580 = vpermps_avx2(auVar143,local_940);
  local_5a0 = auVar21._0_4_;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_980 = ZEXT1632(auVar21);
  local_5c0 = vpermps_avx2(auVar139,local_980);
  local_5e0 = vpermps_avx2(auVar140,local_980);
  local_600 = vpermps_avx2(auVar143,local_980);
  local_620 = auVar105._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_960 = ZEXT1632(auVar105);
  local_640 = vpermps_avx2(auVar139,local_960);
  local_660 = vpermps_avx2(auVar140,local_960);
  local_680 = vpermps_avx2(auVar143,local_960);
  uVar239 = auVar106._0_4_;
  local_6a0._4_4_ = uVar239;
  local_6a0._0_4_ = uVar239;
  fStack_698 = (float)uVar239;
  fStack_694 = (float)uVar239;
  fStack_690 = (float)uVar239;
  fStack_68c = (float)uVar239;
  fStack_688 = (float)uVar239;
  register0x0000131c = uVar239;
  auVar250 = ZEXT3264(_local_6a0);
  _local_9a0 = ZEXT1632(auVar106);
  _local_6c0 = vpermps_avx2(auVar139,_local_9a0);
  _local_6e0 = vpermps_avx2(auVar140,_local_9a0);
  _local_700 = vpermps_avx2(auVar143,_local_9a0);
  auVar104 = vmulss_avx512f(auVar108,auVar108);
  auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar158._0_32_,auVar158._0_32_);
  local_7e0 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar118);
  local_720._0_4_ = local_7e0._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  auVar138._8_4_ = 0x7fffffff;
  auVar138._0_8_ = 0x7fffffff7fffffff;
  auVar138._12_4_ = 0x7fffffff;
  auVar138._16_4_ = 0x7fffffff;
  auVar138._20_4_ = 0x7fffffff;
  auVar138._24_4_ = 0x7fffffff;
  auVar138._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_720,auVar138);
  local_a00 = ZEXT416((uint)local_740);
  local_740 = fVar238 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar157 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar157);
  local_ab8 = 1;
  local_ab0 = 0;
  auVar157 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar157);
  auVar104 = vsqrtss_avx(local_a30,local_a30);
  auVar21 = vsqrtss_avx(local_a30,local_a30);
  auVar236 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar243 = ZEXT3264(_DAT_02020f20);
  auVar194._32_32_ = auVar157._32_32_;
  local_aa0 = auVar194._0_32_;
  do {
    local_ae0 = auVar236._0_16_;
    auVar105 = vmovshdup_avx(local_ae0);
    fVar173 = auVar236._0_4_;
    fVar197 = auVar105._0_4_ - fVar173;
    fVar267 = fVar197 * 0.04761905;
    auVar253._4_4_ = fVar173;
    auVar253._0_4_ = fVar173;
    auVar253._8_4_ = fVar173;
    auVar253._12_4_ = fVar173;
    auVar253._16_4_ = fVar173;
    auVar253._20_4_ = fVar173;
    auVar253._24_4_ = fVar173;
    auVar253._28_4_ = fVar173;
    local_a60._4_4_ = fVar197;
    local_a60._0_4_ = fVar197;
    local_a60._8_4_ = fVar197;
    local_a60._12_4_ = fVar197;
    local_a60._16_4_ = fVar197;
    local_a60._20_4_ = fVar197;
    local_a60._24_4_ = fVar197;
    local_a60._28_4_ = fVar197;
    auVar105 = vfmadd231ps_fma(auVar253,local_a60,auVar243._0_32_);
    auVar182._8_4_ = 0x3f800000;
    auVar182._0_8_ = &DAT_3f8000003f800000;
    auVar182._12_4_ = 0x3f800000;
    auVar182._16_4_ = 0x3f800000;
    auVar182._20_4_ = 0x3f800000;
    auVar182._24_4_ = 0x3f800000;
    auVar182._28_4_ = 0x3f800000;
    auVar116 = vsubps_avx(auVar182,ZEXT1632(auVar105));
    auVar86._4_4_ = fStack_59c;
    auVar86._0_4_ = local_5a0;
    auVar86._8_4_ = fStack_598;
    auVar86._12_4_ = fStack_594;
    auVar86._16_4_ = fStack_590;
    auVar86._20_4_ = fStack_58c;
    auVar86._24_4_ = fStack_588;
    auVar86._28_4_ = fStack_584;
    fVar173 = auVar105._0_4_;
    auVar211._0_4_ = local_5a0 * fVar173;
    fVar257 = auVar105._4_4_;
    auVar211._4_4_ = fStack_59c * fVar257;
    fVar258 = auVar105._8_4_;
    auVar211._8_4_ = fStack_598 * fVar258;
    fVar260 = auVar105._12_4_;
    auVar211._12_4_ = fStack_594 * fVar260;
    auVar211._16_4_ = fStack_590 * 0.0;
    auVar211._20_4_ = fStack_58c * 0.0;
    auVar211._24_4_ = fStack_588 * 0.0;
    auVar211._28_4_ = 0;
    auVar157._0_4_ = local_5c0._0_4_ * fVar173;
    auVar157._4_4_ = local_5c0._4_4_ * fVar257;
    auVar157._8_4_ = local_5c0._8_4_ * fVar258;
    auVar157._12_4_ = local_5c0._12_4_ * fVar260;
    auVar157._16_4_ = local_5c0._16_4_ * 0.0;
    auVar157._20_4_ = local_5c0._20_4_ * 0.0;
    auVar157._28_36_ = auVar236._28_36_;
    auVar157._24_4_ = local_5c0._24_4_ * 0.0;
    auVar236._0_4_ = local_5e0._0_4_ * fVar173;
    auVar236._4_4_ = local_5e0._4_4_ * fVar257;
    auVar236._8_4_ = local_5e0._8_4_ * fVar258;
    auVar236._12_4_ = local_5e0._12_4_ * fVar260;
    auVar236._16_4_ = local_5e0._16_4_ * 0.0;
    auVar236._20_4_ = local_5e0._20_4_ * 0.0;
    auVar236._28_36_ = auVar243._28_36_;
    auVar236._24_4_ = local_5e0._24_4_ * 0.0;
    auVar243._0_4_ = local_600._0_4_ * fVar173;
    auVar243._4_4_ = local_600._4_4_ * fVar257;
    auVar243._8_4_ = local_600._8_4_ * fVar258;
    auVar243._12_4_ = local_600._12_4_ * fVar260;
    auVar243._16_4_ = local_600._16_4_ * 0.0;
    auVar243._20_4_ = local_600._20_4_ * 0.0;
    auVar243._28_36_ = auVar250._28_36_;
    auVar243._24_4_ = local_600._24_4_ * 0.0;
    auVar87._4_4_ = uStack_51c;
    auVar87._0_4_ = local_520;
    auVar87._8_4_ = uStack_518;
    auVar87._12_4_ = uStack_514;
    auVar87._16_4_ = uStack_510;
    auVar87._20_4_ = uStack_50c;
    auVar87._24_4_ = uStack_508;
    auVar87._28_4_ = uStack_504;
    auVar106 = vfmadd231ps_fma(auVar211,auVar116,auVar87);
    auVar102 = vfmadd231ps_fma(auVar157._0_32_,auVar116,local_540);
    auVar107 = vfmadd231ps_fma(auVar236._0_32_,auVar116,local_560);
    auVar2 = vfmadd231ps_fma(auVar243._0_32_,auVar116,local_580);
    auVar85._4_4_ = uStack_61c;
    auVar85._0_4_ = local_620;
    auVar85._8_4_ = uStack_618;
    auVar85._12_4_ = uStack_614;
    auVar85._16_4_ = uStack_610;
    auVar85._20_4_ = uStack_60c;
    auVar85._24_4_ = uStack_608;
    auVar85._28_4_ = uStack_604;
    auVar119 = vmulps_avx512vl(auVar85,ZEXT1632(auVar105));
    auVar125 = ZEXT1632(auVar105);
    auVar120 = vmulps_avx512vl(local_640,auVar125);
    auVar121 = vmulps_avx512vl(local_660,auVar125);
    auVar117 = vmulps_avx512vl(local_680,auVar125);
    auVar103 = vfmadd231ps_fma(auVar119,auVar116,auVar86);
    auVar108 = vfmadd231ps_fma(auVar120,auVar116,local_5c0);
    auVar109 = vfmadd231ps_fma(auVar121,auVar116,local_5e0);
    auVar110 = vfmadd231ps_fma(auVar117,auVar116,local_600);
    auVar46._4_4_ = fVar257 * (float)local_6a0._4_4_;
    auVar46._0_4_ = fVar173 * (float)local_6a0._0_4_;
    auVar46._8_4_ = fVar258 * fStack_698;
    auVar46._12_4_ = fVar260 * fStack_694;
    auVar46._16_4_ = fStack_690 * 0.0;
    auVar46._20_4_ = fStack_68c * 0.0;
    auVar46._24_4_ = fStack_688 * 0.0;
    auVar46._28_4_ = fStack_584;
    auVar47._4_4_ = fVar257 * (float)local_6c0._4_4_;
    auVar47._0_4_ = fVar173 * (float)local_6c0._0_4_;
    auVar47._8_4_ = fVar258 * fStack_6b8;
    auVar47._12_4_ = fVar260 * fStack_6b4;
    auVar47._16_4_ = fStack_6b0 * 0.0;
    auVar47._20_4_ = fStack_6ac * 0.0;
    auVar47._24_4_ = fStack_6a8 * 0.0;
    auVar47._28_4_ = local_5c0._28_4_;
    auVar48._4_4_ = fVar257 * (float)local_6e0._4_4_;
    auVar48._0_4_ = fVar173 * (float)local_6e0._0_4_;
    auVar48._8_4_ = fVar258 * fStack_6d8;
    auVar48._12_4_ = fVar260 * fStack_6d4;
    auVar48._16_4_ = fStack_6d0 * 0.0;
    auVar48._20_4_ = fStack_6cc * 0.0;
    auVar48._24_4_ = fStack_6c8 * 0.0;
    auVar48._28_4_ = local_5e0._28_4_;
    auVar49._4_4_ = fVar257 * (float)local_700._4_4_;
    auVar49._0_4_ = fVar173 * (float)local_700._0_4_;
    auVar49._8_4_ = fVar258 * fStack_6f8;
    auVar49._12_4_ = fVar260 * fStack_6f4;
    auVar49._16_4_ = fStack_6f0 * 0.0;
    auVar49._20_4_ = fStack_6ec * 0.0;
    auVar49._24_4_ = fStack_6e8 * 0.0;
    auVar49._28_4_ = local_600._28_4_;
    auVar119 = vfmadd231ps_avx512vl(auVar46,auVar116,auVar85);
    auVar120 = vfmadd231ps_avx512vl(auVar47,auVar116,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar48,auVar116,local_660);
    auVar117 = vfmadd231ps_avx512vl(auVar49,auVar116,local_680);
    auVar122 = vmulps_avx512vl(auVar125,ZEXT1632(auVar103));
    auVar123 = vmulps_avx512vl(auVar125,ZEXT1632(auVar108));
    auVar124 = vmulps_avx512vl(auVar125,ZEXT1632(auVar109));
    auVar125 = vmulps_avx512vl(auVar125,ZEXT1632(auVar110));
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar106));
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,ZEXT1632(auVar102));
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,ZEXT1632(auVar107));
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar116,ZEXT1632(auVar2));
    auVar212._0_4_ = auVar119._0_4_ * fVar173;
    auVar212._4_4_ = auVar119._4_4_ * fVar257;
    auVar212._8_4_ = auVar119._8_4_ * fVar258;
    auVar212._12_4_ = auVar119._12_4_ * fVar260;
    auVar212._16_4_ = auVar119._16_4_ * 0.0;
    auVar212._20_4_ = auVar119._20_4_ * 0.0;
    auVar212._24_4_ = auVar119._24_4_ * 0.0;
    auVar212._28_4_ = 0;
    auVar50._4_4_ = auVar120._4_4_ * fVar257;
    auVar50._0_4_ = auVar120._0_4_ * fVar173;
    auVar50._8_4_ = auVar120._8_4_ * fVar258;
    auVar50._12_4_ = auVar120._12_4_ * fVar260;
    auVar50._16_4_ = auVar120._16_4_ * 0.0;
    auVar50._20_4_ = auVar120._20_4_ * 0.0;
    auVar50._24_4_ = auVar120._24_4_ * 0.0;
    auVar50._28_4_ = auVar119._28_4_;
    auVar51._4_4_ = auVar121._4_4_ * fVar257;
    auVar51._0_4_ = auVar121._0_4_ * fVar173;
    auVar51._8_4_ = auVar121._8_4_ * fVar258;
    auVar51._12_4_ = auVar121._12_4_ * fVar260;
    auVar51._16_4_ = auVar121._16_4_ * 0.0;
    auVar51._20_4_ = auVar121._20_4_ * 0.0;
    auVar51._24_4_ = auVar121._24_4_ * 0.0;
    auVar51._28_4_ = auVar120._28_4_;
    auVar52._4_4_ = auVar117._4_4_ * fVar257;
    auVar52._0_4_ = auVar117._0_4_ * fVar173;
    auVar52._8_4_ = auVar117._8_4_ * fVar258;
    auVar52._12_4_ = auVar117._12_4_ * fVar260;
    auVar52._16_4_ = auVar117._16_4_ * 0.0;
    auVar52._20_4_ = auVar117._20_4_ * 0.0;
    auVar52._24_4_ = auVar117._24_4_ * 0.0;
    auVar52._28_4_ = auVar121._28_4_;
    auVar106 = vfmadd231ps_fma(auVar212,auVar116,ZEXT1632(auVar103));
    auVar102 = vfmadd231ps_fma(auVar50,auVar116,ZEXT1632(auVar108));
    auVar107 = vfmadd231ps_fma(auVar51,auVar116,ZEXT1632(auVar109));
    auVar2 = vfmadd231ps_fma(auVar52,auVar116,ZEXT1632(auVar110));
    auVar119 = vmulps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar107));
    auVar117 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar260 * auVar106._12_4_,
                                             CONCAT48(fVar258 * auVar106._8_4_,
                                                      CONCAT44(fVar257 * auVar106._4_4_,
                                                               fVar173 * auVar106._0_4_)))),auVar116
                          ,auVar122);
    auVar250 = ZEXT3264(auVar117);
    auVar115 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar102._12_4_ * fVar260,
                                             CONCAT48(auVar102._8_4_ * fVar258,
                                                      CONCAT44(auVar102._4_4_ * fVar257,
                                                               auVar102._0_4_ * fVar173)))),auVar116
                          ,auVar123);
    auVar126 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar124);
    auVar120 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar2._12_4_ * fVar260,
                                             CONCAT48(auVar2._8_4_ * fVar258,
                                                      CONCAT44(auVar2._4_4_ * fVar257,
                                                               auVar2._0_4_ * fVar173)))),auVar125,
                          auVar116);
    auVar116 = vsubps_avx512vl(ZEXT1632(auVar106),auVar122);
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar102),auVar123);
    auVar121 = vsubps_avx512vl(ZEXT1632(auVar107),auVar124);
    auVar122 = vsubps_avx512vl(ZEXT1632(auVar2),auVar125);
    auVar269._0_4_ = fVar267 * auVar116._0_4_ * 3.0;
    auVar269._4_4_ = fVar267 * auVar116._4_4_ * 3.0;
    auVar269._8_4_ = fVar267 * auVar116._8_4_ * 3.0;
    auVar269._12_4_ = fVar267 * auVar116._12_4_ * 3.0;
    auVar269._16_4_ = fVar267 * auVar116._16_4_ * 3.0;
    auVar269._20_4_ = fVar267 * auVar116._20_4_ * 3.0;
    auVar269._24_4_ = fVar267 * auVar116._24_4_ * 3.0;
    auVar269._28_4_ = 0;
    auVar271._0_4_ = fVar267 * auVar119._0_4_ * 3.0;
    auVar271._4_4_ = fVar267 * auVar119._4_4_ * 3.0;
    auVar271._8_4_ = fVar267 * auVar119._8_4_ * 3.0;
    auVar271._12_4_ = fVar267 * auVar119._12_4_ * 3.0;
    auVar271._16_4_ = fVar267 * auVar119._16_4_ * 3.0;
    auVar271._20_4_ = fVar267 * auVar119._20_4_ * 3.0;
    auVar271._24_4_ = fVar267 * auVar119._24_4_ * 3.0;
    auVar271._28_4_ = 0;
    auVar272._0_4_ = auVar121._0_4_ * 3.0 * fVar267;
    auVar272._4_4_ = auVar121._4_4_ * 3.0 * fVar267;
    auVar272._8_4_ = auVar121._8_4_ * 3.0 * fVar267;
    auVar272._12_4_ = auVar121._12_4_ * 3.0 * fVar267;
    auVar272._16_4_ = auVar121._16_4_ * 3.0 * fVar267;
    auVar272._20_4_ = auVar121._20_4_ * 3.0 * fVar267;
    auVar272._24_4_ = auVar121._24_4_ * 3.0 * fVar267;
    auVar272._28_4_ = 0;
    fVar173 = auVar122._0_4_ * 3.0 * fVar267;
    fVar257 = auVar122._4_4_ * 3.0 * fVar267;
    auVar53._4_4_ = fVar257;
    auVar53._0_4_ = fVar173;
    fVar258 = auVar122._8_4_ * 3.0 * fVar267;
    auVar53._8_4_ = fVar258;
    fVar260 = auVar122._12_4_ * 3.0 * fVar267;
    auVar53._12_4_ = fVar260;
    fVar262 = auVar122._16_4_ * 3.0 * fVar267;
    auVar53._16_4_ = fVar262;
    fVar237 = auVar122._20_4_ * 3.0 * fVar267;
    auVar53._20_4_ = fVar237;
    fVar263 = auVar122._24_4_ * 3.0 * fVar267;
    auVar53._24_4_ = fVar263;
    auVar53._28_4_ = fVar267;
    auVar105 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar122 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,ZEXT1632(auVar105));
    auVar123 = vpermt2ps_avx512vl(auVar115,_DAT_0205fd20,ZEXT1632(auVar105));
    auVar121 = ZEXT1632(auVar105);
    auVar124 = vpermt2ps_avx512vl(auVar126,_DAT_0205fd20,auVar121);
    auVar213._0_4_ = auVar120._0_4_ + fVar173;
    auVar213._4_4_ = auVar120._4_4_ + fVar257;
    auVar213._8_4_ = auVar120._8_4_ + fVar258;
    auVar213._12_4_ = auVar120._12_4_ + fVar260;
    auVar213._16_4_ = auVar120._16_4_ + fVar262;
    auVar213._20_4_ = auVar120._20_4_ + fVar237;
    auVar213._24_4_ = auVar120._24_4_ + fVar263;
    auVar213._28_4_ = auVar120._28_4_ + fVar267;
    auVar116 = vmaxps_avx(auVar120,auVar213);
    auVar119 = vminps_avx(auVar120,auVar213);
    auVar125 = vpermt2ps_avx512vl(auVar120,_DAT_0205fd20,auVar121);
    auVar127 = vpermt2ps_avx512vl(auVar269,_DAT_0205fd20,auVar121);
    auVar113 = vpermt2ps_avx512vl(auVar271,_DAT_0205fd20,auVar121);
    auVar139 = ZEXT1632(auVar105);
    auVar114 = vpermt2ps_avx512vl(auVar272,_DAT_0205fd20,auVar139);
    auVar120 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar139);
    auVar128 = vsubps_avx512vl(auVar125,auVar120);
    auVar120 = vsubps_avx(auVar122,auVar117);
    auVar121 = vsubps_avx(auVar123,auVar115);
    auVar129 = vsubps_avx512vl(auVar124,auVar126);
    auVar130 = vmulps_avx512vl(auVar121,auVar272);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar271,auVar129);
    auVar131 = vmulps_avx512vl(auVar129,auVar269);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar272,auVar120);
    auVar132 = vmulps_avx512vl(auVar120,auVar271);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar269,auVar121);
    auVar132 = vmulps_avx512vl(auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar130);
    auVar131 = vmulps_avx512vl(auVar129,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar121,auVar121);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar120,auVar120);
    auVar132 = vrcp14ps_avx512vl(auVar131);
    auVar133 = vfnmadd213ps_avx512vl(auVar132,auVar131,auVar182);
    auVar132 = vfmadd132ps_avx512vl(auVar133,auVar132,auVar132);
    auVar130 = vmulps_avx512vl(auVar130,auVar132);
    auVar133 = vmulps_avx512vl(auVar121,auVar114);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar113,auVar129);
    auVar134 = vmulps_avx512vl(auVar129,auVar127);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar114,auVar120);
    auVar135 = vmulps_avx512vl(auVar120,auVar113);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar127,auVar121);
    auVar135 = vmulps_avx512vl(auVar135,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar132 = vmulps_avx512vl(auVar133,auVar132);
    auVar130 = vmaxps_avx512vl(auVar130,auVar132);
    auVar130 = vsqrtps_avx512vl(auVar130);
    auVar132 = vmaxps_avx512vl(auVar128,auVar125);
    auVar116 = vmaxps_avx512vl(auVar116,auVar132);
    auVar132 = vaddps_avx512vl(auVar130,auVar116);
    auVar116 = vminps_avx512vl(auVar128,auVar125);
    auVar116 = vminps_avx(auVar119,auVar116);
    auVar116 = vsubps_avx512vl(auVar116,auVar130);
    auVar144._8_4_ = 0x3f800002;
    auVar144._0_8_ = 0x3f8000023f800002;
    auVar144._12_4_ = 0x3f800002;
    auVar144._16_4_ = 0x3f800002;
    auVar144._20_4_ = 0x3f800002;
    auVar144._24_4_ = 0x3f800002;
    auVar144._28_4_ = 0x3f800002;
    auVar119 = vmulps_avx512vl(auVar132,auVar144);
    auVar145._8_4_ = 0x3f7ffffc;
    auVar145._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar145._12_4_ = 0x3f7ffffc;
    auVar145._16_4_ = 0x3f7ffffc;
    auVar145._20_4_ = 0x3f7ffffc;
    auVar145._24_4_ = 0x3f7ffffc;
    auVar145._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar116,auVar145);
    auVar54._4_4_ = auVar119._4_4_ * auVar119._4_4_;
    auVar54._0_4_ = auVar119._0_4_ * auVar119._0_4_;
    auVar54._8_4_ = auVar119._8_4_ * auVar119._8_4_;
    auVar54._12_4_ = auVar119._12_4_ * auVar119._12_4_;
    auVar54._16_4_ = auVar119._16_4_ * auVar119._16_4_;
    auVar54._20_4_ = auVar119._20_4_ * auVar119._20_4_;
    auVar54._24_4_ = auVar119._24_4_ * auVar119._24_4_;
    auVar54._28_4_ = local_a80._28_4_;
    auVar116 = vrsqrt14ps_avx512vl(auVar131);
    auVar146._8_4_ = 0xbf000000;
    auVar146._0_8_ = 0xbf000000bf000000;
    auVar146._12_4_ = 0xbf000000;
    auVar146._16_4_ = 0xbf000000;
    auVar146._20_4_ = 0xbf000000;
    auVar146._24_4_ = 0xbf000000;
    auVar146._28_4_ = 0xbf000000;
    auVar119 = vmulps_avx512vl(auVar131,auVar146);
    auVar55._4_4_ = auVar116._4_4_ * auVar119._4_4_;
    auVar55._0_4_ = auVar116._0_4_ * auVar119._0_4_;
    auVar55._8_4_ = auVar116._8_4_ * auVar119._8_4_;
    auVar55._12_4_ = auVar116._12_4_ * auVar119._12_4_;
    auVar55._16_4_ = auVar116._16_4_ * auVar119._16_4_;
    auVar55._20_4_ = auVar116._20_4_ * auVar119._20_4_;
    auVar55._24_4_ = auVar116._24_4_ * auVar119._24_4_;
    auVar55._28_4_ = auVar119._28_4_;
    auVar119 = vmulps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar119,auVar55);
    auVar33._8_4_ = 0x3fc00000;
    auVar33._0_8_ = 0x3fc000003fc00000;
    auVar33._12_4_ = 0x3fc00000;
    auVar33._16_4_ = 0x3fc00000;
    auVar33._20_4_ = 0x3fc00000;
    auVar33._24_4_ = 0x3fc00000;
    auVar33._28_4_ = 0x3fc00000;
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar33);
    auVar56._4_4_ = auVar119._4_4_ * auVar120._4_4_;
    auVar56._0_4_ = auVar119._0_4_ * auVar120._0_4_;
    auVar56._8_4_ = auVar119._8_4_ * auVar120._8_4_;
    auVar56._12_4_ = auVar119._12_4_ * auVar120._12_4_;
    auVar56._16_4_ = auVar119._16_4_ * auVar120._16_4_;
    auVar56._20_4_ = auVar119._20_4_ * auVar120._20_4_;
    auVar56._24_4_ = auVar119._24_4_ * auVar120._24_4_;
    auVar56._28_4_ = auVar116._28_4_;
    auVar116 = vmulps_avx512vl(auVar121,auVar119);
    auVar125 = vmulps_avx512vl(auVar129,auVar119);
    auVar128 = vsubps_avx512vl(auVar139,auVar117);
    auVar130 = vsubps_avx512vl(auVar139,auVar115);
    auVar131 = vsubps_avx512vl(auVar139,auVar126);
    auVar132 = vmulps_avx512vl(auVar273._0_32_,auVar131);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar158._0_32_,auVar130);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar118,auVar128);
    auVar133 = vmulps_avx512vl(auVar131,auVar131);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar130,auVar130);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar128,auVar128);
    auVar134 = vmulps_avx512vl(auVar273._0_32_,auVar125);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar116,auVar158._0_32_);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar56,auVar118);
    auVar125 = vmulps_avx512vl(auVar131,auVar125);
    auVar116 = vfmadd231ps_avx512vl(auVar125,auVar130,auVar116);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar128,auVar56);
    local_8e0 = vmulps_avx512vl(auVar134,auVar134);
    auVar125 = vsubps_avx512vl(local_720,local_8e0);
    auVar135 = vmulps_avx512vl(auVar134,auVar116);
    auVar132 = vsubps_avx512vl(auVar132,auVar135);
    auVar132 = vaddps_avx512vl(auVar132,auVar132);
    auVar135 = vmulps_avx512vl(auVar116,auVar116);
    auVar133 = vsubps_avx512vl(auVar133,auVar135);
    auVar135 = vsubps_avx512vl(auVar133,auVar54);
    auVar136 = vmulps_avx512vl(auVar132,auVar132);
    auVar34._8_4_ = 0x40800000;
    auVar34._0_8_ = 0x4080000040800000;
    auVar34._12_4_ = 0x40800000;
    auVar34._16_4_ = 0x40800000;
    auVar34._20_4_ = 0x40800000;
    auVar34._24_4_ = 0x40800000;
    auVar34._28_4_ = 0x40800000;
    auVar137 = vmulps_avx512vl(auVar125,auVar34);
    auVar138 = vmulps_avx512vl(auVar137,auVar135);
    auVar138 = vsubps_avx512vl(auVar136,auVar138);
    auVar105 = vxorps_avx512vl(auVar133._0_16_,auVar133._0_16_);
    uVar101 = vcmpps_avx512vl(auVar138,auVar139,5);
    bVar88 = (byte)uVar101;
    if (bVar88 == 0) {
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar138 = vsqrtps_avx512vl(auVar138);
      auVar139 = vaddps_avx512vl(auVar125,auVar125);
      auVar140 = vrcp14ps_avx512vl(auVar139);
      auVar139 = vfnmadd213ps_avx512vl(auVar139,auVar140,auVar182);
      auVar139 = vfmadd132ps_avx512vl(auVar139,auVar140,auVar140);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar140 = vxorps_avx512vl(auVar132,auVar35);
      auVar140 = vsubps_avx512vl(auVar140,auVar138);
      auVar140 = vmulps_avx512vl(auVar140,auVar139);
      auVar138 = vsubps_avx512vl(auVar138,auVar132);
      auVar138 = vmulps_avx512vl(auVar138,auVar139);
      auVar139 = vfmadd213ps_avx512vl(auVar134,auVar140,auVar116);
      local_820 = vmulps_avx512vl(auVar119,auVar139);
      auVar139 = vfmadd213ps_avx512vl(auVar134,auVar138,auVar116);
      local_840 = vmulps_avx512vl(auVar119,auVar139);
      auVar183._8_4_ = 0x7f800000;
      auVar183._0_8_ = 0x7f8000007f800000;
      auVar183._12_4_ = 0x7f800000;
      auVar183._16_4_ = 0x7f800000;
      auVar183._20_4_ = 0x7f800000;
      auVar183._24_4_ = 0x7f800000;
      auVar183._28_4_ = 0x7f800000;
      auVar139 = vblendmps_avx512vl(auVar183,auVar140);
      auVar141._0_4_ =
           (uint)(bVar88 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar88 & 1) * local_840._0_4_;
      bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar7 * auVar139._4_4_ | (uint)!bVar7 * local_840._4_4_;
      bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar7 * auVar139._8_4_ | (uint)!bVar7 * local_840._8_4_;
      bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar7 * auVar139._12_4_ | (uint)!bVar7 * local_840._12_4_;
      bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
      auVar141._16_4_ = (uint)bVar7 * auVar139._16_4_ | (uint)!bVar7 * local_840._16_4_;
      bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
      auVar141._20_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * local_840._20_4_;
      bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
      auVar141._24_4_ = (uint)bVar7 * auVar139._24_4_ | (uint)!bVar7 * local_840._24_4_;
      bVar7 = SUB81(uVar101 >> 7,0);
      auVar141._28_4_ = (uint)bVar7 * auVar139._28_4_ | (uint)!bVar7 * local_840._28_4_;
      auVar184._8_4_ = 0xff800000;
      auVar184._0_8_ = 0xff800000ff800000;
      auVar184._12_4_ = 0xff800000;
      auVar184._16_4_ = 0xff800000;
      auVar184._20_4_ = 0xff800000;
      auVar184._24_4_ = 0xff800000;
      auVar184._28_4_ = 0xff800000;
      auVar139 = vblendmps_avx512vl(auVar184,auVar138);
      auVar142._0_4_ =
           (uint)(bVar88 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar138._0_4_;
      bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
      auVar142._4_4_ = (uint)bVar7 * auVar139._4_4_ | (uint)!bVar7 * auVar138._4_4_;
      bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
      auVar142._8_4_ = (uint)bVar7 * auVar139._8_4_ | (uint)!bVar7 * auVar138._8_4_;
      bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
      auVar142._12_4_ = (uint)bVar7 * auVar139._12_4_ | (uint)!bVar7 * auVar138._12_4_;
      bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
      auVar142._16_4_ = (uint)bVar7 * auVar139._16_4_ | (uint)!bVar7 * auVar138._16_4_;
      bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
      auVar142._20_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * auVar138._20_4_;
      bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
      auVar142._24_4_ = (uint)bVar7 * auVar139._24_4_ | (uint)!bVar7 * auVar138._24_4_;
      bVar7 = SUB81(uVar101 >> 7,0);
      auVar142._28_4_ = (uint)bVar7 * auVar139._28_4_ | (uint)!bVar7 * auVar138._28_4_;
      auVar185._8_4_ = 0x7fffffff;
      auVar185._0_8_ = 0x7fffffff7fffffff;
      auVar185._12_4_ = 0x7fffffff;
      auVar185._16_4_ = 0x7fffffff;
      auVar185._20_4_ = 0x7fffffff;
      auVar185._24_4_ = 0x7fffffff;
      auVar185._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_8e0,auVar185);
      auVar138 = vmaxps_avx512vl(local_7e0,local_8e0);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      auVar139 = vmulps_avx512vl(auVar138,auVar36);
      auVar138 = vandps_avx(auVar125,auVar185);
      uVar92 = vcmpps_avx512vl(auVar138,auVar139,1);
      uVar101 = uVar101 & uVar92;
      bVar96 = (byte)uVar101;
      if (bVar96 != 0) {
        uVar92 = vcmpps_avx512vl(auVar135,ZEXT1632(auVar105),2);
        auVar219._8_4_ = 0xff800000;
        auVar219._0_8_ = 0xff800000ff800000;
        auVar219._12_4_ = 0xff800000;
        auVar219._16_4_ = 0xff800000;
        auVar219._20_4_ = 0xff800000;
        auVar219._24_4_ = 0xff800000;
        auVar219._28_4_ = 0xff800000;
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar139 = vblendmps_avx512vl(auVar135,auVar219);
        bVar91 = (byte)uVar92;
        uVar94 = (uint)(bVar91 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar138._0_4_;
        bVar7 = (bool)((byte)(uVar92 >> 1) & 1);
        uVar166 = (uint)bVar7 * auVar139._4_4_ | (uint)!bVar7 * auVar138._4_4_;
        bVar7 = (bool)((byte)(uVar92 >> 2) & 1);
        uVar167 = (uint)bVar7 * auVar139._8_4_ | (uint)!bVar7 * auVar138._8_4_;
        bVar7 = (bool)((byte)(uVar92 >> 3) & 1);
        uVar168 = (uint)bVar7 * auVar139._12_4_ | (uint)!bVar7 * auVar138._12_4_;
        bVar7 = (bool)((byte)(uVar92 >> 4) & 1);
        uVar169 = (uint)bVar7 * auVar139._16_4_ | (uint)!bVar7 * auVar138._16_4_;
        bVar7 = (bool)((byte)(uVar92 >> 5) & 1);
        uVar170 = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * auVar138._20_4_;
        bVar7 = (bool)((byte)(uVar92 >> 6) & 1);
        uVar171 = (uint)bVar7 * auVar139._24_4_ | (uint)!bVar7 * auVar138._24_4_;
        bVar7 = SUB81(uVar92 >> 7,0);
        uVar172 = (uint)bVar7 * auVar139._28_4_ | (uint)!bVar7 * auVar138._28_4_;
        auVar141._0_4_ = (bVar96 & 1) * uVar94 | !(bool)(bVar96 & 1) * auVar141._0_4_;
        bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar141._4_4_ = bVar7 * uVar166 | !bVar7 * auVar141._4_4_;
        bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar141._8_4_ = bVar7 * uVar167 | !bVar7 * auVar141._8_4_;
        bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar141._12_4_ = bVar7 * uVar168 | !bVar7 * auVar141._12_4_;
        bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar141._16_4_ = bVar7 * uVar169 | !bVar7 * auVar141._16_4_;
        bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar141._20_4_ = bVar7 * uVar170 | !bVar7 * auVar141._20_4_;
        bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar141._24_4_ = bVar7 * uVar171 | !bVar7 * auVar141._24_4_;
        bVar7 = SUB81(uVar101 >> 7,0);
        auVar141._28_4_ = bVar7 * uVar172 | !bVar7 * auVar141._28_4_;
        auVar135 = vblendmps_avx512vl(auVar219,auVar135);
        bVar7 = (bool)((byte)(uVar92 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar92 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar92 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar92 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar92 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
        bVar13 = SUB81(uVar92 >> 7,0);
        auVar142._0_4_ =
             (uint)(bVar96 & 1) *
             ((uint)(bVar91 & 1) * auVar135._0_4_ | !(bool)(bVar91 & 1) * uVar94) |
             !(bool)(bVar96 & 1) * auVar142._0_4_;
        bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar142._4_4_ =
             (uint)bVar100 * ((uint)bVar7 * auVar135._4_4_ | !bVar7 * uVar166) |
             !bVar100 * auVar142._4_4_;
        bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar142._8_4_ =
             (uint)bVar7 * ((uint)bVar8 * auVar135._8_4_ | !bVar8 * uVar167) |
             !bVar7 * auVar142._8_4_;
        bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar142._12_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar135._12_4_ | !bVar9 * uVar168) |
             !bVar7 * auVar142._12_4_;
        bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar142._16_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar135._16_4_ | !bVar10 * uVar169) |
             !bVar7 * auVar142._16_4_;
        bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar142._20_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar135._20_4_ | !bVar11 * uVar170) |
             !bVar7 * auVar142._20_4_;
        bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar142._24_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar135._24_4_ | !bVar12 * uVar171) |
             !bVar7 * auVar142._24_4_;
        bVar7 = SUB81(uVar101 >> 7,0);
        auVar142._28_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar135._28_4_ | !bVar13 * uVar172) |
             !bVar7 * auVar142._28_4_;
        bVar88 = (~bVar96 | bVar91) & bVar88;
      }
      auVar182._8_4_ = 0x3f800000;
      auVar182._0_8_ = &DAT_3f8000003f800000;
      auVar182._12_4_ = 0x3f800000;
      auVar182._16_4_ = 0x3f800000;
      auVar182._20_4_ = 0x3f800000;
      auVar182._24_4_ = 0x3f800000;
      auVar182._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar142);
    if ((bVar88 & 0x7f) == 0) {
      auVar243 = ZEXT3264(_DAT_02020f20);
      auVar194._0_32_ = local_aa0;
      auVar273 = ZEXT3264(local_aa0);
    }
    else {
      fVar173 = *(float *)(ray + k * 4 + 0x200) - (float)local_a00._0_4_;
      auVar186._4_4_ = fVar173;
      auVar186._0_4_ = fVar173;
      auVar186._8_4_ = fVar173;
      auVar186._12_4_ = fVar173;
      auVar186._16_4_ = fVar173;
      auVar186._20_4_ = fVar173;
      auVar186._24_4_ = fVar173;
      auVar186._28_4_ = fVar173;
      auVar135 = vminps_avx512vl(auVar186,auVar142);
      auVar84._4_4_ = fStack_73c;
      auVar84._0_4_ = local_740;
      auVar84._8_4_ = fStack_738;
      auVar84._12_4_ = fStack_734;
      auVar84._16_4_ = fStack_730;
      auVar84._20_4_ = fStack_72c;
      auVar84._24_4_ = fStack_728;
      auVar84._28_4_ = fStack_724;
      auVar138 = vmaxps_avx512vl(auVar84,auVar141);
      auVar131 = vmulps_avx512vl(auVar131,auVar272);
      auVar130 = vfmadd213ps_avx512vl(auVar130,auVar271,auVar131);
      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar269,auVar130);
      auVar273 = ZEXT3264(local_aa0);
      auVar130 = vmulps_avx512vl(local_aa0,auVar272);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar158._0_32_,auVar271);
      in_ZMM31 = ZEXT3264(auVar118);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar118,auVar269);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar130,auVar131);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar23 = vcmpps_avx512vl(auVar131,auVar139,1);
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar128 = vxorps_avx512vl(auVar128,auVar140);
      auVar143 = vrcp14ps_avx512vl(auVar130);
      auVar144 = vxorps_avx512vl(auVar130,auVar140);
      auVar145 = vfnmadd213ps_avx512vl(auVar143,auVar130,auVar182);
      auVar145 = vfmadd132ps_avx512vl(auVar145,auVar143,auVar143);
      auVar145 = vmulps_avx512vl(auVar145,auVar128);
      uVar25 = vcmpps_avx512vl(auVar130,auVar144,1);
      bVar96 = (byte)uVar23 | (byte)uVar25;
      auVar146 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar128 = vblendmps_avx512vl(auVar145,auVar146);
      auVar147._0_4_ =
           (uint)(bVar96 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar143._0_4_;
      bVar7 = (bool)(bVar96 >> 1 & 1);
      auVar147._4_4_ = (uint)bVar7 * auVar128._4_4_ | (uint)!bVar7 * auVar143._4_4_;
      bVar7 = (bool)(bVar96 >> 2 & 1);
      auVar147._8_4_ = (uint)bVar7 * auVar128._8_4_ | (uint)!bVar7 * auVar143._8_4_;
      bVar7 = (bool)(bVar96 >> 3 & 1);
      auVar147._12_4_ = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * auVar143._12_4_;
      bVar7 = (bool)(bVar96 >> 4 & 1);
      auVar147._16_4_ = (uint)bVar7 * auVar128._16_4_ | (uint)!bVar7 * auVar143._16_4_;
      bVar7 = (bool)(bVar96 >> 5 & 1);
      auVar147._20_4_ = (uint)bVar7 * auVar128._20_4_ | (uint)!bVar7 * auVar143._20_4_;
      bVar7 = (bool)(bVar96 >> 6 & 1);
      auVar147._24_4_ = (uint)bVar7 * auVar128._24_4_ | (uint)!bVar7 * auVar143._24_4_;
      auVar147._28_4_ =
           (uint)(bVar96 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar96 >> 7) * auVar143._28_4_;
      auVar128 = vmaxps_avx(auVar138,auVar147);
      uVar25 = vcmpps_avx512vl(auVar130,auVar144,6);
      bVar96 = (byte)uVar23 | (byte)uVar25;
      auVar148._0_4_ = (uint)(bVar96 & 1) * 0x7f800000 | (uint)!(bool)(bVar96 & 1) * auVar145._0_4_;
      bVar7 = (bool)(bVar96 >> 1 & 1);
      auVar148._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._4_4_;
      bVar7 = (bool)(bVar96 >> 2 & 1);
      auVar148._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._8_4_;
      bVar7 = (bool)(bVar96 >> 3 & 1);
      auVar148._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._12_4_;
      bVar7 = (bool)(bVar96 >> 4 & 1);
      auVar148._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._16_4_;
      bVar7 = (bool)(bVar96 >> 5 & 1);
      auVar148._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._20_4_;
      bVar7 = (bool)(bVar96 >> 6 & 1);
      auVar148._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar145._24_4_;
      auVar148._28_4_ =
           (uint)(bVar96 >> 7) * 0x7f800000 | (uint)!(bool)(bVar96 >> 7) * auVar145._28_4_;
      auVar130 = vminps_avx(auVar135,auVar148);
      auVar105 = vxorps_avx512vl(auVar144._0_16_,auVar144._0_16_);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar105),auVar122);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar105),auVar123);
      auVar135 = ZEXT1632(auVar105);
      auVar124 = vsubps_avx512vl(auVar135,auVar124);
      auVar57._4_4_ = auVar124._4_4_ * auVar114._4_4_;
      auVar57._0_4_ = auVar124._0_4_ * auVar114._0_4_;
      auVar57._8_4_ = auVar124._8_4_ * auVar114._8_4_;
      auVar57._12_4_ = auVar124._12_4_ * auVar114._12_4_;
      auVar57._16_4_ = auVar124._16_4_ * auVar114._16_4_;
      auVar57._20_4_ = auVar124._20_4_ * auVar114._20_4_;
      auVar57._24_4_ = auVar124._24_4_ * auVar114._24_4_;
      auVar57._28_4_ = auVar124._28_4_;
      auVar123 = vfnmsub231ps_avx512vl(auVar57,auVar113,auVar123);
      auVar122 = vfnmadd231ps_avx512vl(auVar123,auVar127,auVar122);
      auVar123 = vmulps_avx512vl(local_aa0,auVar114);
      auVar123 = vfnmsub231ps_avx512vl(auVar123,auVar158._0_32_,auVar113);
      auVar123 = vfnmadd231ps_avx512vl(auVar123,auVar118,auVar127);
      vandps_avx512vl(auVar123,auVar131);
      uVar23 = vcmpps_avx512vl(auVar123,auVar139,1);
      auVar122 = vxorps_avx512vl(auVar122,auVar140);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar127 = vxorps_avx512vl(auVar123,auVar140);
      auVar114 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar182);
      auVar105 = vfmadd132ps_fma(auVar114,auVar124,auVar124);
      fVar173 = auVar105._0_4_ * auVar122._0_4_;
      fVar257 = auVar105._4_4_ * auVar122._4_4_;
      auVar58._4_4_ = fVar257;
      auVar58._0_4_ = fVar173;
      fVar258 = auVar105._8_4_ * auVar122._8_4_;
      auVar58._8_4_ = fVar258;
      fVar260 = auVar105._12_4_ * auVar122._12_4_;
      auVar58._12_4_ = fVar260;
      fVar267 = auVar122._16_4_ * 0.0;
      auVar58._16_4_ = fVar267;
      fVar262 = auVar122._20_4_ * 0.0;
      auVar58._20_4_ = fVar262;
      fVar237 = auVar122._24_4_ * 0.0;
      auVar58._24_4_ = fVar237;
      auVar58._28_4_ = auVar122._28_4_;
      uVar25 = vcmpps_avx512vl(auVar123,auVar127,1);
      bVar96 = (byte)uVar23 | (byte)uVar25;
      auVar114 = vblendmps_avx512vl(auVar58,auVar146);
      auVar149._0_4_ =
           (uint)(bVar96 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar124._0_4_;
      bVar7 = (bool)(bVar96 >> 1 & 1);
      auVar149._4_4_ = (uint)bVar7 * auVar114._4_4_ | (uint)!bVar7 * auVar124._4_4_;
      bVar7 = (bool)(bVar96 >> 2 & 1);
      auVar149._8_4_ = (uint)bVar7 * auVar114._8_4_ | (uint)!bVar7 * auVar124._8_4_;
      bVar7 = (bool)(bVar96 >> 3 & 1);
      auVar149._12_4_ = (uint)bVar7 * auVar114._12_4_ | (uint)!bVar7 * auVar124._12_4_;
      bVar7 = (bool)(bVar96 >> 4 & 1);
      auVar149._16_4_ = (uint)bVar7 * auVar114._16_4_ | (uint)!bVar7 * auVar124._16_4_;
      bVar7 = (bool)(bVar96 >> 5 & 1);
      auVar149._20_4_ = (uint)bVar7 * auVar114._20_4_ | (uint)!bVar7 * auVar124._20_4_;
      bVar7 = (bool)(bVar96 >> 6 & 1);
      auVar149._24_4_ = (uint)bVar7 * auVar114._24_4_ | (uint)!bVar7 * auVar124._24_4_;
      auVar149._28_4_ =
           (uint)(bVar96 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar96 >> 7) * auVar124._28_4_;
      _local_920 = vmaxps_avx(auVar128,auVar149);
      uVar25 = vcmpps_avx512vl(auVar123,auVar127,6);
      bVar96 = (byte)uVar23 | (byte)uVar25;
      auVar150._0_4_ = (uint)(bVar96 & 1) * 0x7f800000 | (uint)!(bool)(bVar96 & 1) * (int)fVar173;
      bVar7 = (bool)(bVar96 >> 1 & 1);
      auVar150._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar257;
      bVar7 = (bool)(bVar96 >> 2 & 1);
      auVar150._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar258;
      bVar7 = (bool)(bVar96 >> 3 & 1);
      auVar150._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar260;
      bVar7 = (bool)(bVar96 >> 4 & 1);
      auVar150._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar267;
      bVar7 = (bool)(bVar96 >> 5 & 1);
      auVar150._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar262;
      bVar7 = (bool)(bVar96 >> 6 & 1);
      auVar150._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar237;
      auVar150._28_4_ =
           (uint)(bVar96 >> 7) * 0x7f800000 | (uint)!(bool)(bVar96 >> 7) * auVar122._28_4_;
      local_7a0 = vminps_avx(auVar130,auVar150);
      uVar23 = vcmpps_avx512vl(_local_920,local_7a0,2);
      bVar88 = bVar88 & 0x7f & (byte)uVar23;
      if (bVar88 == 0) {
        auVar243 = ZEXT3264(_DAT_02020f20);
        auVar158._32_32_ = auVar194._32_32_;
        auVar194 = auVar158;
      }
      else {
        auVar124 = vmaxps_avx512vl(auVar135,local_a80);
        auVar122 = vminps_avx512vl(local_820,auVar182);
        auVar66 = ZEXT412(0);
        auVar123 = ZEXT1232(auVar66) << 0x20;
        auVar122 = vmaxps_avx(auVar122,ZEXT1232(auVar66) << 0x20);
        auVar127 = vminps_avx512vl(local_840,auVar182);
        auVar59._4_4_ = (auVar122._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar122._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar122._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar122._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar122._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar122._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar122._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar122._28_4_ + 7.0;
        auVar105 = vfmadd213ps_fma(auVar59,local_a60,auVar253);
        local_820 = ZEXT1632(auVar105);
        auVar122 = vmaxps_avx(auVar127,ZEXT1232(auVar66) << 0x20);
        auVar60._4_4_ = (auVar122._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar122._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar122._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar122._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar122._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar122._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar122._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar122._28_4_ + 7.0;
        auVar105 = vfmadd213ps_fma(auVar60,local_a60,auVar253);
        local_840 = ZEXT1632(auVar105);
        auVar187._0_4_ = auVar124._0_4_ * auVar124._0_4_;
        auVar187._4_4_ = auVar124._4_4_ * auVar124._4_4_;
        auVar187._8_4_ = auVar124._8_4_ * auVar124._8_4_;
        auVar187._12_4_ = auVar124._12_4_ * auVar124._12_4_;
        auVar187._16_4_ = auVar124._16_4_ * auVar124._16_4_;
        auVar187._20_4_ = auVar124._20_4_ * auVar124._20_4_;
        auVar187._24_4_ = auVar124._24_4_ * auVar124._24_4_;
        auVar187._28_4_ = 0;
        auVar122 = vsubps_avx(auVar133,auVar187);
        auVar124 = vmulps_avx512vl(auVar137,auVar122);
        auVar124 = vsubps_avx512vl(auVar136,auVar124);
        uVar23 = vcmpps_avx512vl(auVar124,ZEXT1232(auVar66) << 0x20,5);
        bVar96 = (byte)uVar23;
        if (bVar96 == 0) {
          auVar116 = ZEXT832(0) << 0x20;
          auVar119 = ZEXT832(0) << 0x20;
          auVar127 = ZEXT832(0) << 0x20;
          auVar113 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar124 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar152._8_4_ = 0xff800000;
          auVar152._0_8_ = 0xff800000ff800000;
          auVar152._12_4_ = 0xff800000;
          auVar152._16_4_ = 0xff800000;
          auVar152._20_4_ = 0xff800000;
          auVar152._24_4_ = 0xff800000;
          auVar152._28_4_ = 0xff800000;
        }
        else {
          auVar106 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
          uVar101 = vcmpps_avx512vl(auVar124,auVar135,5);
          auVar123 = vsqrtps_avx(auVar124);
          auVar214._0_4_ = auVar125._0_4_ + auVar125._0_4_;
          auVar214._4_4_ = auVar125._4_4_ + auVar125._4_4_;
          auVar214._8_4_ = auVar125._8_4_ + auVar125._8_4_;
          auVar214._12_4_ = auVar125._12_4_ + auVar125._12_4_;
          auVar214._16_4_ = auVar125._16_4_ + auVar125._16_4_;
          auVar214._20_4_ = auVar125._20_4_ + auVar125._20_4_;
          auVar214._24_4_ = auVar125._24_4_ + auVar125._24_4_;
          auVar214._28_4_ = auVar125._28_4_ + auVar125._28_4_;
          auVar124 = vrcp14ps_avx512vl(auVar214);
          auVar127 = vfnmadd213ps_avx512vl(auVar214,auVar124,auVar182);
          auVar105 = vfmadd132ps_fma(auVar127,auVar124,auVar124);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar37._16_4_ = 0x80000000;
          auVar37._20_4_ = 0x80000000;
          auVar37._24_4_ = 0x80000000;
          auVar37._28_4_ = 0x80000000;
          auVar124 = vxorps_avx512vl(auVar132,auVar37);
          auVar124 = vsubps_avx(auVar124,auVar123);
          auVar61._4_4_ = auVar124._4_4_ * auVar105._4_4_;
          auVar61._0_4_ = auVar124._0_4_ * auVar105._0_4_;
          auVar61._8_4_ = auVar124._8_4_ * auVar105._8_4_;
          auVar61._12_4_ = auVar124._12_4_ * auVar105._12_4_;
          auVar61._16_4_ = auVar124._16_4_ * 0.0;
          auVar61._20_4_ = auVar124._20_4_ * 0.0;
          auVar61._24_4_ = auVar124._24_4_ * 0.0;
          auVar61._28_4_ = 0x3e000000;
          auVar123 = vsubps_avx512vl(auVar123,auVar132);
          auVar62._4_4_ = auVar123._4_4_ * auVar105._4_4_;
          auVar62._0_4_ = auVar123._0_4_ * auVar105._0_4_;
          auVar62._8_4_ = auVar123._8_4_ * auVar105._8_4_;
          auVar62._12_4_ = auVar123._12_4_ * auVar105._12_4_;
          auVar62._16_4_ = auVar123._16_4_ * 0.0;
          auVar62._20_4_ = auVar123._20_4_ * 0.0;
          auVar62._24_4_ = auVar123._24_4_ * 0.0;
          auVar62._28_4_ = fVar197;
          auVar123 = vfmadd213ps_avx512vl(auVar134,auVar61,auVar116);
          auVar63._4_4_ = auVar119._4_4_ * auVar123._4_4_;
          auVar63._0_4_ = auVar119._0_4_ * auVar123._0_4_;
          auVar63._8_4_ = auVar119._8_4_ * auVar123._8_4_;
          auVar63._12_4_ = auVar119._12_4_ * auVar123._12_4_;
          auVar63._16_4_ = auVar119._16_4_ * auVar123._16_4_;
          auVar63._20_4_ = auVar119._20_4_ * auVar123._20_4_;
          auVar63._24_4_ = auVar119._24_4_ * auVar123._24_4_;
          auVar63._28_4_ = auVar124._28_4_;
          auVar123 = vmulps_avx512vl(auVar118,auVar61);
          auVar124 = vmulps_avx512vl(auVar158._0_32_,auVar61);
          auVar114 = vmulps_avx512vl(local_aa0,auVar61);
          auVar127 = vfmadd213ps_avx512vl(auVar120,auVar63,auVar117);
          auVar127 = vsubps_avx512vl(auVar123,auVar127);
          auVar123 = vfmadd213ps_avx512vl(auVar121,auVar63,auVar115);
          auVar113 = vsubps_avx512vl(auVar124,auVar123);
          auVar105 = vfmadd213ps_fma(auVar63,auVar129,auVar126);
          auVar124 = vsubps_avx(auVar114,ZEXT1632(auVar105));
          auVar116 = vfmadd213ps_avx512vl(auVar134,auVar62,auVar116);
          auVar119 = vmulps_avx512vl(auVar119,auVar116);
          auVar116 = vmulps_avx512vl(auVar118,auVar62);
          auVar114 = vmulps_avx512vl(auVar158._0_32_,auVar62);
          auVar128 = vmulps_avx512vl(local_aa0,auVar62);
          auVar105 = vfmadd213ps_fma(auVar120,auVar119,auVar117);
          auVar123 = vsubps_avx(auVar116,ZEXT1632(auVar105));
          auVar105 = vfmadd213ps_fma(auVar121,auVar119,auVar115);
          auVar116 = vsubps_avx512vl(auVar114,ZEXT1632(auVar105));
          auVar105 = vfmadd213ps_fma(auVar129,auVar119,auVar126);
          auVar119 = vsubps_avx512vl(auVar128,ZEXT1632(auVar105));
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar120 = vblendmps_avx512vl(auVar232,auVar61);
          bVar7 = (bool)((byte)uVar101 & 1);
          auVar151._0_4_ = (uint)bVar7 * auVar120._0_4_ | (uint)!bVar7 * auVar117._0_4_;
          bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar7 * auVar120._4_4_ | (uint)!bVar7 * auVar117._4_4_;
          bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar7 * auVar120._8_4_ | (uint)!bVar7 * auVar117._8_4_;
          bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar7 * auVar120._12_4_ | (uint)!bVar7 * auVar117._12_4_;
          bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar7 * auVar120._16_4_ | (uint)!bVar7 * auVar117._16_4_;
          bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar7 * auVar120._20_4_ | (uint)!bVar7 * auVar117._20_4_;
          bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar7 * auVar120._24_4_ | (uint)!bVar7 * auVar117._24_4_;
          bVar7 = SUB81(uVar101 >> 7,0);
          auVar151._28_4_ = (uint)bVar7 * auVar120._28_4_ | (uint)!bVar7 * auVar117._28_4_;
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar120 = vblendmps_avx512vl(auVar233,auVar62);
          bVar7 = (bool)((byte)uVar101 & 1);
          auVar152._0_4_ = (uint)bVar7 * auVar120._0_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar152._4_4_ = (uint)bVar7 * auVar120._4_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar152._8_4_ = (uint)bVar7 * auVar120._8_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar152._12_4_ = (uint)bVar7 * auVar120._12_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
          auVar152._16_4_ = (uint)bVar7 * auVar120._16_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
          auVar152._20_4_ = (uint)bVar7 * auVar120._20_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
          auVar152._24_4_ = (uint)bVar7 * auVar120._24_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = SUB81(uVar101 >> 7,0);
          auVar152._28_4_ = (uint)bVar7 * auVar120._28_4_ | (uint)!bVar7 * -0x800000;
          auVar264._8_4_ = 0x7fffffff;
          auVar264._0_8_ = 0x7fffffff7fffffff;
          auVar264._12_4_ = 0x7fffffff;
          auVar264._16_4_ = 0x7fffffff;
          auVar264._20_4_ = 0x7fffffff;
          auVar264._24_4_ = 0x7fffffff;
          auVar264._28_4_ = 0x7fffffff;
          auVar120 = vandps_avx(auVar264,local_8e0);
          auVar120 = vmaxps_avx(local_7e0,auVar120);
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar121 = vmulps_avx512vl(auVar120,auVar38);
          auVar120 = vandps_avx(auVar125,auVar264);
          uVar92 = vcmpps_avx512vl(auVar120,auVar121,1);
          uVar101 = uVar101 & uVar92;
          bVar91 = (byte)uVar101;
          if (bVar91 != 0) {
            uVar92 = vcmpps_avx512vl(auVar122,ZEXT1632(auVar106),2);
            auVar265._8_4_ = 0xff800000;
            auVar265._0_8_ = 0xff800000ff800000;
            auVar265._12_4_ = 0xff800000;
            auVar265._16_4_ = 0xff800000;
            auVar265._20_4_ = 0xff800000;
            auVar265._24_4_ = 0xff800000;
            auVar265._28_4_ = 0xff800000;
            auVar270._8_4_ = 0x7f800000;
            auVar270._0_8_ = 0x7f8000007f800000;
            auVar270._12_4_ = 0x7f800000;
            auVar270._16_4_ = 0x7f800000;
            auVar270._20_4_ = 0x7f800000;
            auVar270._24_4_ = 0x7f800000;
            auVar270._28_4_ = 0x7f800000;
            auVar120 = vblendmps_avx512vl(auVar270,auVar265);
            bVar95 = (byte)uVar92;
            uVar94 = (uint)(bVar95 & 1) * auVar120._0_4_ |
                     (uint)!(bool)(bVar95 & 1) * auVar121._0_4_;
            bVar7 = (bool)((byte)(uVar92 >> 1) & 1);
            uVar166 = (uint)bVar7 * auVar120._4_4_ | (uint)!bVar7 * auVar121._4_4_;
            bVar7 = (bool)((byte)(uVar92 >> 2) & 1);
            uVar167 = (uint)bVar7 * auVar120._8_4_ | (uint)!bVar7 * auVar121._8_4_;
            bVar7 = (bool)((byte)(uVar92 >> 3) & 1);
            uVar168 = (uint)bVar7 * auVar120._12_4_ | (uint)!bVar7 * auVar121._12_4_;
            bVar7 = (bool)((byte)(uVar92 >> 4) & 1);
            uVar169 = (uint)bVar7 * auVar120._16_4_ | (uint)!bVar7 * auVar121._16_4_;
            bVar7 = (bool)((byte)(uVar92 >> 5) & 1);
            uVar170 = (uint)bVar7 * auVar120._20_4_ | (uint)!bVar7 * auVar121._20_4_;
            bVar7 = (bool)((byte)(uVar92 >> 6) & 1);
            uVar171 = (uint)bVar7 * auVar120._24_4_ | (uint)!bVar7 * auVar121._24_4_;
            bVar7 = SUB81(uVar92 >> 7,0);
            uVar172 = (uint)bVar7 * auVar120._28_4_ | (uint)!bVar7 * auVar121._28_4_;
            auVar151._0_4_ = (bVar91 & 1) * uVar94 | !(bool)(bVar91 & 1) * auVar151._0_4_;
            bVar7 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar151._4_4_ = bVar7 * uVar166 | !bVar7 * auVar151._4_4_;
            bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar151._8_4_ = bVar7 * uVar167 | !bVar7 * auVar151._8_4_;
            bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar151._12_4_ = bVar7 * uVar168 | !bVar7 * auVar151._12_4_;
            bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar151._16_4_ = bVar7 * uVar169 | !bVar7 * auVar151._16_4_;
            bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar151._20_4_ = bVar7 * uVar170 | !bVar7 * auVar151._20_4_;
            bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar151._24_4_ = bVar7 * uVar171 | !bVar7 * auVar151._24_4_;
            bVar7 = SUB81(uVar101 >> 7,0);
            auVar151._28_4_ = bVar7 * uVar172 | !bVar7 * auVar151._28_4_;
            auVar120 = vblendmps_avx512vl(auVar265,auVar270);
            bVar7 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar92 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar92 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar92 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar92 >> 6) & 1);
            bVar13 = SUB81(uVar92 >> 7,0);
            auVar152._0_4_ =
                 (uint)(bVar91 & 1) *
                 ((uint)(bVar95 & 1) * auVar120._0_4_ | !(bool)(bVar95 & 1) * uVar94) |
                 !(bool)(bVar91 & 1) * auVar152._0_4_;
            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar152._4_4_ =
                 (uint)bVar100 * ((uint)bVar7 * auVar120._4_4_ | !bVar7 * uVar166) |
                 !bVar100 * auVar152._4_4_;
            bVar7 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar152._8_4_ =
                 (uint)bVar7 * ((uint)bVar8 * auVar120._8_4_ | !bVar8 * uVar167) |
                 !bVar7 * auVar152._8_4_;
            bVar7 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar152._12_4_ =
                 (uint)bVar7 * ((uint)bVar9 * auVar120._12_4_ | !bVar9 * uVar168) |
                 !bVar7 * auVar152._12_4_;
            bVar7 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar152._16_4_ =
                 (uint)bVar7 * ((uint)bVar10 * auVar120._16_4_ | !bVar10 * uVar169) |
                 !bVar7 * auVar152._16_4_;
            bVar7 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar152._20_4_ =
                 (uint)bVar7 * ((uint)bVar11 * auVar120._20_4_ | !bVar11 * uVar170) |
                 !bVar7 * auVar152._20_4_;
            bVar7 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar152._24_4_ =
                 (uint)bVar7 * ((uint)bVar12 * auVar120._24_4_ | !bVar12 * uVar171) |
                 !bVar7 * auVar152._24_4_;
            bVar7 = SUB81(uVar101 >> 7,0);
            auVar152._28_4_ =
                 (uint)bVar7 * ((uint)bVar13 * auVar120._28_4_ | !bVar13 * uVar172) |
                 !bVar7 * auVar152._28_4_;
            bVar96 = (~bVar91 | bVar95) & bVar96;
          }
        }
        auVar268._8_4_ = 0x7fffffff;
        auVar268._0_8_ = 0x7fffffff7fffffff;
        auVar268._12_4_ = 0x7fffffff;
        auVar119 = vmulps_avx512vl(local_aa0,auVar119);
        auVar116 = vfmadd231ps_avx512vl(auVar119,auVar158._0_32_,auVar116);
        auVar194._0_32_ = vfmadd231ps_avx512vl(auVar116,auVar118,auVar123);
        _local_500 = _local_920;
        local_4e0 = vminps_avx(local_7a0,auVar151);
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar256._16_4_ = 0x7fffffff;
        auVar256._20_4_ = 0x7fffffff;
        auVar256._24_4_ = 0x7fffffff;
        auVar256._28_4_ = 0x7fffffff;
        auVar116 = vandps_avx(auVar194._0_32_,auVar256);
        auVar250 = ZEXT3264(auVar116);
        _local_880 = vmaxps_avx(_local_920,auVar152);
        _local_7c0 = _local_880;
        auVar234._8_4_ = 0x3e99999a;
        auVar234._0_8_ = 0x3e99999a3e99999a;
        auVar234._12_4_ = 0x3e99999a;
        auVar234._16_4_ = 0x3e99999a;
        auVar234._20_4_ = 0x3e99999a;
        auVar234._24_4_ = 0x3e99999a;
        auVar234._28_4_ = 0x3e99999a;
        uVar23 = vcmpps_avx512vl(auVar116,auVar234,1);
        uVar25 = vcmpps_avx512vl(_local_920,local_4e0,2);
        bVar91 = (byte)uVar25 & bVar88;
        uVar24 = vcmpps_avx512vl(_local_880,local_7a0,2);
        if ((bVar88 & ((byte)uVar24 | (byte)uVar25)) == 0) {
          auVar243 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar116 = vmulps_avx512vl(local_aa0,auVar124);
          auVar116 = vfmadd213ps_avx512vl(auVar113,auVar158._0_32_,auVar116);
          auVar116 = vfmadd213ps_avx512vl(auVar127,auVar118,auVar116);
          auVar116 = vandps_avx(auVar116,auVar256);
          uVar25 = vcmpps_avx512vl(auVar116,auVar234,1);
          bVar95 = (byte)uVar25 | ~bVar96;
          auVar188._8_4_ = 2;
          auVar188._0_8_ = 0x200000002;
          auVar188._12_4_ = 2;
          auVar188._16_4_ = 2;
          auVar188._20_4_ = 2;
          auVar188._24_4_ = 2;
          auVar188._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar116 = vpblendmd_avx512vl(auVar188,auVar39);
          local_780._0_4_ = (uint)(bVar95 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar95 & 1) * 2;
          bVar7 = (bool)(bVar95 >> 1 & 1);
          local_780._4_4_ = (uint)bVar7 * auVar116._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 2 & 1);
          local_780._8_4_ = (uint)bVar7 * auVar116._8_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 3 & 1);
          local_780._12_4_ = (uint)bVar7 * auVar116._12_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 4 & 1);
          local_780._16_4_ = (uint)bVar7 * auVar116._16_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 5 & 1);
          local_780._20_4_ = (uint)bVar7 * auVar116._20_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 6 & 1);
          local_780._24_4_ = (uint)bVar7 * auVar116._24_4_ | (uint)!bVar7 * 2;
          local_780._28_4_ = (uint)(bVar95 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar95 >> 7) * 2;
          auVar162._0_32_ = vpbroadcastd_avx512vl();
          auVar162._32_32_ = auVar194._32_32_;
          local_800 = auVar162._0_32_;
          uVar25 = vpcmpd_avx512vl(auVar162._0_32_,local_780,5);
          bVar95 = (byte)uVar25 & bVar91;
          if (bVar95 != 0) {
            auVar106 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar105 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar102 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar107 = vminps_avx(auVar106,auVar102);
            auVar106 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar102 = vmaxps_avx(auVar105,auVar106);
            auVar105 = vandps_avx(auVar268,auVar107);
            auVar106 = vandps_avx(auVar268,auVar102);
            auVar105 = vmaxps_avx(auVar105,auVar106);
            auVar106 = vmovshdup_avx(auVar105);
            auVar106 = vmaxss_avx(auVar106,auVar105);
            auVar105 = vshufpd_avx(auVar105,auVar105,1);
            auVar105 = vmaxss_avx(auVar105,auVar106);
            fVar173 = auVar105._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar102,auVar102,0xff);
            local_860 = (float)local_920._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_920._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_918 + fStack_8f8;
            fStack_854 = fStack_914 + fStack_8f4;
            fStack_850 = fStack_910 + fStack_8f0;
            fStack_84c = fStack_90c + fStack_8ec;
            fStack_848 = fStack_908 + fStack_8e8;
            fStack_844 = fStack_904 + fStack_8e4;
            do {
              auVar189._8_4_ = 0x7f800000;
              auVar189._0_8_ = 0x7f8000007f800000;
              auVar189._12_4_ = 0x7f800000;
              auVar189._16_4_ = 0x7f800000;
              auVar189._20_4_ = 0x7f800000;
              auVar189._24_4_ = 0x7f800000;
              auVar189._28_4_ = 0x7f800000;
              auVar116 = vblendmps_avx512vl(auVar189,_local_920);
              auVar153._0_4_ =
                   (uint)(bVar95 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar95 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar7 * auVar116._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar7 * auVar116._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar7 * auVar116._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar7 * auVar116._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar7 * auVar116._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar153._24_4_ =
                   (uint)(bVar95 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar95 >> 6) * 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar162._0_32_ = auVar153;
              auVar116 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar116 = vminps_avx(auVar153,auVar116);
              auVar119 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar119);
              auVar119 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar119);
              uVar25 = vcmpps_avx512vl(auVar153,auVar116,0);
              bVar89 = (byte)uVar25 & bVar95;
              bVar90 = bVar95;
              if (bVar89 != 0) {
                bVar90 = bVar89;
              }
              iVar26 = 0;
              for (uVar94 = (uint)bVar90; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar26 = iVar26 + 1;
              }
              fVar257 = *(float *)(local_820 + (uint)(iVar26 << 2));
              fVar258 = *(float *)(local_500 + (uint)(iVar26 << 2));
              fVar260 = auVar21._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_a30._0_4_);
              }
              lVar99 = 4;
              do {
                auVar174._4_4_ = fVar258;
                auVar174._0_4_ = fVar258;
                auVar174._8_4_ = fVar258;
                auVar174._12_4_ = fVar258;
                auVar106 = vfmadd132ps_fma(auVar174,ZEXT816(0) << 0x40,local_a20);
                fVar267 = 1.0 - fVar257;
                auVar220._0_4_ = local_980._0_4_ * fVar257;
                auVar220._4_4_ = local_980._4_4_ * fVar257;
                auVar220._8_4_ = local_980._8_4_ * fVar257;
                auVar220._12_4_ = local_980._12_4_ * fVar257;
                local_9b0 = ZEXT416((uint)fVar267);
                auVar240._4_4_ = fVar267;
                auVar240._0_4_ = fVar267;
                auVar240._8_4_ = fVar267;
                auVar240._12_4_ = fVar267;
                auVar105 = vfmadd231ps_fma(auVar220,auVar240,local_940._0_16_);
                auVar244._0_4_ = local_960._0_4_ * fVar257;
                auVar244._4_4_ = local_960._4_4_ * fVar257;
                auVar244._8_4_ = local_960._8_4_ * fVar257;
                auVar244._12_4_ = local_960._12_4_ * fVar257;
                auVar102 = vfmadd231ps_fma(auVar244,auVar240,local_980._0_16_);
                auVar251._0_4_ = fVar257 * (float)local_9a0._0_4_;
                auVar251._4_4_ = fVar257 * (float)local_9a0._4_4_;
                auVar251._8_4_ = fVar257 * fStack_998;
                auVar251._12_4_ = fVar257 * fStack_994;
                auVar107 = vfmadd231ps_fma(auVar251,auVar240,local_960._0_16_);
                auVar254._0_4_ = fVar257 * auVar102._0_4_;
                auVar254._4_4_ = fVar257 * auVar102._4_4_;
                auVar254._8_4_ = fVar257 * auVar102._8_4_;
                auVar254._12_4_ = fVar257 * auVar102._12_4_;
                auVar105 = vfmadd231ps_fma(auVar254,auVar240,auVar105);
                auVar221._0_4_ = fVar257 * auVar107._0_4_;
                auVar221._4_4_ = fVar257 * auVar107._4_4_;
                auVar221._8_4_ = fVar257 * auVar107._8_4_;
                auVar221._12_4_ = fVar257 * auVar107._12_4_;
                auVar102 = vfmadd231ps_fma(auVar221,auVar240,auVar102);
                auVar245._0_4_ = fVar257 * auVar102._0_4_;
                auVar245._4_4_ = fVar257 * auVar102._4_4_;
                auVar245._8_4_ = fVar257 * auVar102._8_4_;
                auVar245._12_4_ = fVar257 * auVar102._12_4_;
                auVar107 = vfmadd231ps_fma(auVar245,auVar105,auVar240);
                auVar105 = vsubps_avx(auVar102,auVar105);
                auVar27._8_4_ = 0x40400000;
                auVar27._0_8_ = 0x4040000040400000;
                auVar27._12_4_ = 0x40400000;
                auVar116 = auVar162._32_32_;
                auVar102 = vmulps_avx512vl(auVar105,auVar27);
                local_8e0._0_16_ = auVar107;
                auVar105 = vsubps_avx(auVar106,auVar107);
                local_a60._0_16_ = auVar105;
                auVar105 = vdpps_avx(auVar105,auVar105,0x7f);
                local_a80._0_16_ = auVar105;
                local_bc0 = ZEXT416((uint)fVar257);
                if (auVar105._0_4_ < 0.0) {
                  auVar250._0_4_ = sqrtf(auVar105._0_4_);
                  auVar250._4_60_ = extraout_var;
                  auVar105 = auVar250._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                }
                local_9c0 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar267 = local_9c0._0_4_;
                auVar222._4_12_ = ZEXT812(0) << 0x20;
                auVar222._0_4_ = fVar267;
                auVar106 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
                fVar197 = auVar106._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(local_9c0,auVar28);
                auVar106 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar94 = auVar105._0_4_;
                if (fVar267 < auVar107._0_4_) {
                  auVar273._0_4_ = sqrtf(fVar267);
                  auVar273._4_60_ = extraout_var_00;
                  auVar105 = ZEXT416(uVar94);
                  auVar107 = auVar273._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar267 = fVar197 * 1.5 + fVar267 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar175._0_4_ = auVar102._0_4_ * fVar267;
                auVar175._4_4_ = auVar102._4_4_ * fVar267;
                auVar175._8_4_ = auVar102._8_4_ * fVar267;
                auVar175._12_4_ = auVar102._12_4_ * fVar267;
                auVar2 = vdpps_avx(local_a60._0_16_,auVar175,0x7f);
                fVar237 = auVar105._0_4_;
                fVar197 = auVar2._0_4_;
                auVar176._0_4_ = fVar197 * fVar197;
                auVar176._4_4_ = auVar2._4_4_ * auVar2._4_4_;
                auVar176._8_4_ = auVar2._8_4_ * auVar2._8_4_;
                auVar176._12_4_ = auVar2._12_4_ * auVar2._12_4_;
                auVar108 = vsubps_avx512vl(local_a80._0_16_,auVar176);
                fVar262 = auVar108._0_4_;
                auVar199._4_12_ = ZEXT812(0) << 0x20;
                auVar199._0_4_ = fVar262;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
                auVar109 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar110 = vmulss_avx512f(auVar108,ZEXT416(0xbf000000));
                if (fVar262 < 0.0) {
                  local_9f0 = fVar267;
                  fStack_9ec = fVar267;
                  fStack_9e8 = fVar267;
                  fStack_9e4 = fVar267;
                  local_9e0 = auVar103;
                  fVar262 = sqrtf(fVar262);
                  auVar110 = ZEXT416(auVar110._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar105 = ZEXT416(uVar94);
                  auVar103 = local_9e0;
                  fVar267 = local_9f0;
                  fVar263 = fStack_9ec;
                  fVar259 = fStack_9e8;
                  fVar261 = fStack_9e4;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar262 = auVar108._0_4_;
                  fVar263 = fVar267;
                  fVar259 = fVar267;
                  fVar261 = fVar267;
                }
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar159._32_32_ = auVar116;
                auVar159._0_32_ = local_aa0;
                auVar273 = ZEXT3264(local_aa0);
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar198 = auVar108._0_4_ * 6.0;
                fVar22 = fVar257 * 6.0;
                auVar223._0_4_ = fVar22 * (float)local_9a0._0_4_;
                auVar223._4_4_ = fVar22 * (float)local_9a0._4_4_;
                auVar223._8_4_ = fVar22 * fStack_998;
                auVar223._12_4_ = fVar22 * fStack_994;
                auVar200._4_4_ = fVar198;
                auVar200._0_4_ = fVar198;
                auVar200._8_4_ = fVar198;
                auVar200._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar200,auVar223,local_960._0_16_);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar198 = auVar112._0_4_ * 6.0;
                auVar224._4_4_ = fVar198;
                auVar224._0_4_ = fVar198;
                auVar224._8_4_ = fVar198;
                auVar224._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar224,auVar108,local_980._0_16_);
                fVar198 = local_9b0._0_4_ * 6.0;
                auVar201._4_4_ = fVar198;
                auVar201._0_4_ = fVar198;
                auVar201._8_4_ = fVar198;
                auVar201._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar201,auVar108,local_940._0_16_);
                auVar225._0_4_ = auVar108._0_4_ * (float)local_9c0._0_4_;
                auVar225._4_4_ = auVar108._4_4_ * (float)local_9c0._0_4_;
                auVar225._8_4_ = auVar108._8_4_ * (float)local_9c0._0_4_;
                auVar225._12_4_ = auVar108._12_4_ * (float)local_9c0._0_4_;
                auVar108 = vdpps_avx(auVar102,auVar108,0x7f);
                fVar198 = auVar108._0_4_;
                auVar202._0_4_ = auVar102._0_4_ * fVar198;
                auVar202._4_4_ = auVar102._4_4_ * fVar198;
                auVar202._8_4_ = auVar102._8_4_ * fVar198;
                auVar202._12_4_ = auVar102._12_4_ * fVar198;
                auVar108 = vsubps_avx(auVar225,auVar202);
                fVar198 = auVar106._0_4_ * (float)local_9d0._0_4_;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar162._16_48_ = auVar159._16_48_;
                auVar111 = vxorps_avx512vl(auVar102,auVar29);
                auVar246._0_4_ = fVar267 * auVar108._0_4_ * fVar198;
                auVar246._4_4_ = fVar263 * auVar108._4_4_ * fVar198;
                auVar246._8_4_ = fVar259 * auVar108._8_4_ * fVar198;
                auVar246._12_4_ = fVar261 * auVar108._12_4_ * fVar198;
                auVar106 = vdpps_avx(auVar111,auVar175,0x7f);
                auVar108 = vmaxss_avx(ZEXT416((uint)fVar173),
                                      ZEXT416((uint)(fVar258 * fVar260 * 1.9073486e-06)));
                auVar112 = vdivss_avx512f(ZEXT416((uint)fVar173),auVar107);
                auVar107 = vdpps_avx(local_a60._0_16_,auVar246,0x7f);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar173),auVar108);
                auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),auVar112,auVar105);
                auVar105 = vdpps_avx(local_a20,auVar175,0x7f);
                fVar267 = auVar106._0_4_ + auVar107._0_4_;
                auVar106 = vdpps_avx(local_a60._0_16_,auVar111,0x7f);
                auVar110 = vmulss_avx512f(auVar110,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar107 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar162._0_16_ =
                     vaddss_avx512f(auVar109,ZEXT416((uint)(auVar110._0_4_ * auVar103._0_4_)));
                auVar103 = vfnmadd231ss_fma(auVar106,auVar2,ZEXT416((uint)fVar267));
                auVar109 = vfnmadd231ss_fma(auVar107,auVar2,auVar105);
                auVar106 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar262 = fVar262 - auVar106._0_4_;
                auVar106 = vshufps_avx(auVar102,auVar102,0xff);
                auVar107 = vfmsub213ss_fma(auVar103,auVar162._0_16_,auVar106);
                fVar237 = auVar109._0_4_ * auVar162._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar107._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar237));
                fVar263 = auVar103._0_4_;
                fVar267 = fVar262 * (fVar267 / fVar263) - fVar197 * (auVar107._0_4_ / fVar263);
                auVar250 = ZEXT464((uint)fVar267);
                fVar257 = fVar257 - (fVar197 * (fVar237 / fVar263) -
                                    fVar262 * (auVar105._0_4_ / fVar263));
                fVar258 = fVar258 - fVar267;
                auVar105 = vandps_avx(auVar2,auVar268);
                if (auVar112._0_4_ <= auVar105._0_4_) {
LAB_01d12f06:
                  bVar7 = false;
                }
                else {
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar112._0_4_ + auVar108._0_4_)),
                                             local_a10,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(auVar268,ZEXT416((uint)fVar262));
                  if (auVar107._0_4_ <= auVar105._0_4_) goto LAB_01d12f06;
                  fVar258 = fVar258 + (float)local_a00._0_4_;
                  bVar7 = true;
                  if (fVar238 <= fVar258) {
                    fVar267 = *(float *)(ray + k * 4 + 0x200);
                    auVar250 = ZEXT464((uint)fVar267);
                    if (((fVar258 <= fVar267) && (0.0 <= fVar257)) && (fVar257 <= 1.0)) {
                      auVar161._16_48_ = auVar162._16_48_;
                      auVar161._0_16_ = ZEXT816(0) << 0x20;
                      auVar160._4_60_ = auVar161._4_60_;
                      auVar160._0_4_ = local_a80._0_4_;
                      auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar160._0_16_);
                      fVar197 = auVar105._0_4_;
                      auVar162._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar98].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar197 = fVar197 * 1.5 + auVar162._0_4_ * fVar197 * fVar197 * fVar197;
                        auVar203._0_4_ = local_a60._0_4_ * fVar197;
                        auVar203._4_4_ = local_a60._4_4_ * fVar197;
                        auVar203._8_4_ = local_a60._8_4_ * fVar197;
                        auVar203._12_4_ = local_a60._12_4_ * fVar197;
                        auVar107 = vfmadd213ps_fma(auVar106,auVar203,auVar102);
                        auVar105 = vshufps_avx(auVar203,auVar203,0xc9);
                        auVar106 = vshufps_avx(auVar102,auVar102,0xc9);
                        auVar204._0_4_ = auVar203._0_4_ * auVar106._0_4_;
                        auVar204._4_4_ = auVar203._4_4_ * auVar106._4_4_;
                        auVar204._8_4_ = auVar203._8_4_ * auVar106._8_4_;
                        auVar204._12_4_ = auVar203._12_4_ * auVar106._12_4_;
                        auVar102 = vfmsub231ps_fma(auVar204,auVar102,auVar105);
                        auVar105 = vshufps_avx(auVar102,auVar102,0xc9);
                        auVar106 = vshufps_avx(auVar107,auVar107,0xc9);
                        auVar102 = vshufps_avx(auVar102,auVar102,0xd2);
                        auVar177._0_4_ = auVar107._0_4_ * auVar102._0_4_;
                        auVar177._4_4_ = auVar107._4_4_ * auVar102._4_4_;
                        auVar177._8_4_ = auVar107._8_4_ * auVar102._8_4_;
                        auVar177._12_4_ = auVar107._12_4_ * auVar102._12_4_;
                        auVar105 = vfmsub231ps_fma(auVar177,auVar105,auVar106);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          uVar239 = vextractps_avx(auVar105,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar239;
                          uVar239 = vextractps_avx(auVar105,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar239;
                          *(int *)(ray + k * 4 + 0x380) = auVar105._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar257;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(undefined4 *)(ray + k * 4 + 0x440) = uVar1;
                          *(uint *)(ray + k * 4 + 0x480) = uVar98;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar5 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar257));
                          auVar194 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar194 = vpermps_avx512f(auVar194,ZEXT1664(auVar105));
                          auVar157 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar157,ZEXT1664(auVar105));
                          local_380 = vbroadcastss_avx512f(auVar105);
                          local_400[0] = (RTCHitN)auVar194[0];
                          local_400[1] = (RTCHitN)auVar194[1];
                          local_400[2] = (RTCHitN)auVar194[2];
                          local_400[3] = (RTCHitN)auVar194[3];
                          local_400[4] = (RTCHitN)auVar194[4];
                          local_400[5] = (RTCHitN)auVar194[5];
                          local_400[6] = (RTCHitN)auVar194[6];
                          local_400[7] = (RTCHitN)auVar194[7];
                          local_400[8] = (RTCHitN)auVar194[8];
                          local_400[9] = (RTCHitN)auVar194[9];
                          local_400[10] = (RTCHitN)auVar194[10];
                          local_400[0xb] = (RTCHitN)auVar194[0xb];
                          local_400[0xc] = (RTCHitN)auVar194[0xc];
                          local_400[0xd] = (RTCHitN)auVar194[0xd];
                          local_400[0xe] = (RTCHitN)auVar194[0xe];
                          local_400[0xf] = (RTCHitN)auVar194[0xf];
                          local_400[0x10] = (RTCHitN)auVar194[0x10];
                          local_400[0x11] = (RTCHitN)auVar194[0x11];
                          local_400[0x12] = (RTCHitN)auVar194[0x12];
                          local_400[0x13] = (RTCHitN)auVar194[0x13];
                          local_400[0x14] = (RTCHitN)auVar194[0x14];
                          local_400[0x15] = (RTCHitN)auVar194[0x15];
                          local_400[0x16] = (RTCHitN)auVar194[0x16];
                          local_400[0x17] = (RTCHitN)auVar194[0x17];
                          local_400[0x18] = (RTCHitN)auVar194[0x18];
                          local_400[0x19] = (RTCHitN)auVar194[0x19];
                          local_400[0x1a] = (RTCHitN)auVar194[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar194[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar194[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar194[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar194[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar194[0x1f];
                          local_400[0x20] = (RTCHitN)auVar194[0x20];
                          local_400[0x21] = (RTCHitN)auVar194[0x21];
                          local_400[0x22] = (RTCHitN)auVar194[0x22];
                          local_400[0x23] = (RTCHitN)auVar194[0x23];
                          local_400[0x24] = (RTCHitN)auVar194[0x24];
                          local_400[0x25] = (RTCHitN)auVar194[0x25];
                          local_400[0x26] = (RTCHitN)auVar194[0x26];
                          local_400[0x27] = (RTCHitN)auVar194[0x27];
                          local_400[0x28] = (RTCHitN)auVar194[0x28];
                          local_400[0x29] = (RTCHitN)auVar194[0x29];
                          local_400[0x2a] = (RTCHitN)auVar194[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar194[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar194[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar194[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar194[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar194[0x2f];
                          local_400[0x30] = (RTCHitN)auVar194[0x30];
                          local_400[0x31] = (RTCHitN)auVar194[0x31];
                          local_400[0x32] = (RTCHitN)auVar194[0x32];
                          local_400[0x33] = (RTCHitN)auVar194[0x33];
                          local_400[0x34] = (RTCHitN)auVar194[0x34];
                          local_400[0x35] = (RTCHitN)auVar194[0x35];
                          local_400[0x36] = (RTCHitN)auVar194[0x36];
                          local_400[0x37] = (RTCHitN)auVar194[0x37];
                          local_400[0x38] = (RTCHitN)auVar194[0x38];
                          local_400[0x39] = (RTCHitN)auVar194[0x39];
                          local_400[0x3a] = (RTCHitN)auVar194[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar194[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar194[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar194[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar194[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar194[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar194 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar194);
                          auVar116 = vpcmpeqd_avx2(auVar194._0_32_,auVar194._0_32_);
                          local_ad0[3] = auVar116;
                          local_ad0[2] = auVar116;
                          local_ad0[1] = auVar116;
                          *local_ad0 = auVar116;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar4->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_b10);
                            auVar273 = ZEXT3264(local_aa0);
                            auVar268._8_4_ = 0x7fffffff;
                            auVar268._0_8_ = 0x7fffffff7fffffff;
                            auVar268._12_4_ = 0x7fffffff;
                          }
                          auVar162 = vmovdqa64_avx512f(local_8c0);
                          uVar25 = vptestmd_avx512f(auVar162,auVar162);
                          if ((short)uVar25 == 0) {
LAB_01d131dc:
                            *(float *)(ray + k * 4 + 0x200) = fVar267;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_b10);
                              auVar273 = ZEXT3264(local_aa0);
                              auVar268._8_4_ = 0x7fffffff;
                              auVar268._0_8_ = 0x7fffffff7fffffff;
                              auVar268._12_4_ = 0x7fffffff;
                            }
                            auVar162 = vmovdqa64_avx512f(local_8c0);
                            uVar101 = vptestmd_avx512f(auVar162,auVar162);
                            if ((short)uVar101 == 0) goto LAB_01d131dc;
                            iVar67 = *(int *)(local_b10.hit + 4);
                            iVar68 = *(int *)(local_b10.hit + 8);
                            iVar69 = *(int *)(local_b10.hit + 0xc);
                            iVar70 = *(int *)(local_b10.hit + 0x10);
                            iVar71 = *(int *)(local_b10.hit + 0x14);
                            iVar72 = *(int *)(local_b10.hit + 0x18);
                            iVar73 = *(int *)(local_b10.hit + 0x1c);
                            iVar74 = *(int *)(local_b10.hit + 0x20);
                            iVar75 = *(int *)(local_b10.hit + 0x24);
                            iVar76 = *(int *)(local_b10.hit + 0x28);
                            iVar77 = *(int *)(local_b10.hit + 0x2c);
                            iVar78 = *(int *)(local_b10.hit + 0x30);
                            iVar79 = *(int *)(local_b10.hit + 0x34);
                            iVar80 = *(int *)(local_b10.hit + 0x38);
                            iVar81 = *(int *)(local_b10.hit + 0x3c);
                            bVar90 = (byte)uVar101;
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar89 = (byte)(uVar101 >> 8);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar90 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x33c);
                            iVar67 = *(int *)(local_b10.hit + 0x44);
                            iVar68 = *(int *)(local_b10.hit + 0x48);
                            iVar69 = *(int *)(local_b10.hit + 0x4c);
                            iVar70 = *(int *)(local_b10.hit + 0x50);
                            iVar71 = *(int *)(local_b10.hit + 0x54);
                            iVar72 = *(int *)(local_b10.hit + 0x58);
                            iVar73 = *(int *)(local_b10.hit + 0x5c);
                            iVar74 = *(int *)(local_b10.hit + 0x60);
                            iVar75 = *(int *)(local_b10.hit + 100);
                            iVar76 = *(int *)(local_b10.hit + 0x68);
                            iVar77 = *(int *)(local_b10.hit + 0x6c);
                            iVar78 = *(int *)(local_b10.hit + 0x70);
                            iVar79 = *(int *)(local_b10.hit + 0x74);
                            iVar80 = *(int *)(local_b10.hit + 0x78);
                            iVar81 = *(int *)(local_b10.hit + 0x7c);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x37c);
                            iVar67 = *(int *)(local_b10.hit + 0x84);
                            iVar68 = *(int *)(local_b10.hit + 0x88);
                            iVar69 = *(int *)(local_b10.hit + 0x8c);
                            iVar70 = *(int *)(local_b10.hit + 0x90);
                            iVar71 = *(int *)(local_b10.hit + 0x94);
                            iVar72 = *(int *)(local_b10.hit + 0x98);
                            iVar73 = *(int *)(local_b10.hit + 0x9c);
                            iVar74 = *(int *)(local_b10.hit + 0xa0);
                            iVar75 = *(int *)(local_b10.hit + 0xa4);
                            iVar76 = *(int *)(local_b10.hit + 0xa8);
                            iVar77 = *(int *)(local_b10.hit + 0xac);
                            iVar78 = *(int *)(local_b10.hit + 0xb0);
                            iVar79 = *(int *)(local_b10.hit + 0xb4);
                            iVar80 = *(int *)(local_b10.hit + 0xb8);
                            iVar81 = *(int *)(local_b10.hit + 0xbc);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3bc);
                            iVar67 = *(int *)(local_b10.hit + 0xc4);
                            iVar68 = *(int *)(local_b10.hit + 200);
                            iVar69 = *(int *)(local_b10.hit + 0xcc);
                            iVar70 = *(int *)(local_b10.hit + 0xd0);
                            iVar71 = *(int *)(local_b10.hit + 0xd4);
                            iVar72 = *(int *)(local_b10.hit + 0xd8);
                            iVar73 = *(int *)(local_b10.hit + 0xdc);
                            iVar74 = *(int *)(local_b10.hit + 0xe0);
                            iVar75 = *(int *)(local_b10.hit + 0xe4);
                            iVar76 = *(int *)(local_b10.hit + 0xe8);
                            iVar77 = *(int *)(local_b10.hit + 0xec);
                            iVar78 = *(int *)(local_b10.hit + 0xf0);
                            iVar79 = *(int *)(local_b10.hit + 0xf4);
                            iVar80 = *(int *)(local_b10.hit + 0xf8);
                            iVar81 = *(int *)(local_b10.hit + 0xfc);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3fc);
                            iVar67 = *(int *)(local_b10.hit + 0x104);
                            iVar68 = *(int *)(local_b10.hit + 0x108);
                            iVar69 = *(int *)(local_b10.hit + 0x10c);
                            iVar70 = *(int *)(local_b10.hit + 0x110);
                            iVar71 = *(int *)(local_b10.hit + 0x114);
                            iVar72 = *(int *)(local_b10.hit + 0x118);
                            iVar73 = *(int *)(local_b10.hit + 0x11c);
                            iVar74 = *(int *)(local_b10.hit + 0x120);
                            iVar75 = *(int *)(local_b10.hit + 0x124);
                            iVar76 = *(int *)(local_b10.hit + 0x128);
                            iVar77 = *(int *)(local_b10.hit + 300);
                            iVar78 = *(int *)(local_b10.hit + 0x130);
                            iVar79 = *(int *)(local_b10.hit + 0x134);
                            iVar80 = *(int *)(local_b10.hit + 0x138);
                            iVar81 = *(int *)(local_b10.hit + 0x13c);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x43c);
                            auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar194 = vmovdqu32_avx512f(auVar194);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar194;
                            auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar194 = vmovdqu32_avx512f(auVar194);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar194;
                            auVar157 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar194 = vmovdqa32_avx512f(auVar157);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar194;
                            auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            auVar64._4_56_ = auVar194._8_56_;
                            auVar64._0_4_ =
                                 (uint)bVar100 * auVar194._4_4_ | (uint)!bVar100 * auVar157._4_4_;
                            auVar162._0_8_ = auVar64._0_8_ << 0x20;
                            bVar100 = (bool)((byte)(uVar101 >> 2) & 1);
                            auVar162._8_4_ =
                                 (uint)bVar100 * auVar194._8_4_ | (uint)!bVar100 * auVar157._8_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 3) & 1);
                            auVar162._12_4_ =
                                 (uint)bVar100 * auVar194._12_4_ | (uint)!bVar100 * auVar157._12_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 4) & 1);
                            auVar162._16_4_ =
                                 (uint)bVar100 * auVar194._16_4_ | (uint)!bVar100 * auVar157._16_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 5) & 1);
                            auVar162._20_4_ =
                                 (uint)bVar100 * auVar194._20_4_ | (uint)!bVar100 * auVar157._20_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 6) & 1);
                            auVar162._24_4_ =
                                 (uint)bVar100 * auVar194._24_4_ | (uint)!bVar100 * auVar157._24_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 7) & 1);
                            auVar162._28_4_ =
                                 (uint)bVar100 * auVar194._28_4_ | (uint)!bVar100 * auVar157._28_4_;
                            auVar162._32_4_ =
                                 (uint)(bVar89 & 1) * auVar194._32_4_ |
                                 (uint)!(bool)(bVar89 & 1) * auVar157._32_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 9) & 1);
                            auVar162._36_4_ =
                                 (uint)bVar100 * auVar194._36_4_ | (uint)!bVar100 * auVar157._36_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 10) & 1);
                            auVar162._40_4_ =
                                 (uint)bVar100 * auVar194._40_4_ | (uint)!bVar100 * auVar157._40_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            auVar162._44_4_ =
                                 (uint)bVar100 * auVar194._44_4_ | (uint)!bVar100 * auVar157._44_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            auVar162._48_4_ =
                                 (uint)bVar100 * auVar194._48_4_ | (uint)!bVar100 * auVar157._48_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            auVar162._52_4_ =
                                 (uint)bVar100 * auVar194._52_4_ | (uint)!bVar100 * auVar157._52_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            auVar162._56_4_ =
                                 (uint)bVar100 * auVar194._56_4_ | (uint)!bVar100 * auVar157._56_4_;
                            bVar100 = SUB81(uVar101 >> 0xf,0);
                            auVar162._60_4_ =
                                 (uint)bVar100 * auVar194._60_4_ | (uint)!bVar100 * auVar157._60_4_;
                            auVar194 = vmovdqa32_avx512f(auVar194);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar194;
                          }
                          auVar250 = ZEXT464((uint)fVar267);
                        }
                      }
                    }
                  }
                }
                auVar194._32_32_ = auVar162._32_32_;
                bVar100 = lVar99 != 0;
                lVar99 = lVar99 + -1;
              } while ((!bVar7) && (bVar100));
              auVar82._4_4_ = fStack_85c;
              auVar82._0_4_ = local_860;
              auVar82._8_4_ = fStack_858;
              auVar82._12_4_ = fStack_854;
              auVar82._16_4_ = fStack_850;
              auVar82._20_4_ = fStack_84c;
              auVar82._24_4_ = fStack_848;
              auVar82._28_4_ = fStack_844;
              uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar40._4_4_ = uVar239;
              auVar40._0_4_ = uVar239;
              auVar40._8_4_ = uVar239;
              auVar40._12_4_ = uVar239;
              auVar40._16_4_ = uVar239;
              auVar40._20_4_ = uVar239;
              auVar40._24_4_ = uVar239;
              auVar40._28_4_ = uVar239;
              uVar25 = vcmpps_avx512vl(auVar82,auVar40,2);
              bVar95 = ~('\x01' << ((byte)iVar26 & 0x1f)) & bVar95 & (byte)uVar25;
            } while (bVar95 != 0);
          }
          auVar190._0_4_ = (float)local_880._0_4_ + (float)local_900._0_4_;
          auVar190._4_4_ = (float)local_880._4_4_ + (float)local_900._4_4_;
          auVar190._8_4_ = fStack_878 + fStack_8f8;
          auVar190._12_4_ = fStack_874 + fStack_8f4;
          auVar190._16_4_ = fStack_870 + fStack_8f0;
          auVar190._20_4_ = fStack_86c + fStack_8ec;
          auVar190._24_4_ = fStack_868 + fStack_8e8;
          auVar190._28_4_ = fStack_864 + fStack_8e4;
          uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar41._4_4_ = uVar239;
          auVar41._0_4_ = uVar239;
          auVar41._8_4_ = uVar239;
          auVar41._12_4_ = uVar239;
          auVar41._16_4_ = uVar239;
          auVar41._20_4_ = uVar239;
          auVar41._24_4_ = uVar239;
          auVar41._28_4_ = uVar239;
          uVar25 = vcmpps_avx512vl(auVar190,auVar41,2);
          bVar96 = (byte)uVar23 | ~bVar96;
          bVar88 = (byte)uVar24 & bVar88 & (byte)uVar25;
          auVar191._8_4_ = 2;
          auVar191._0_8_ = 0x200000002;
          auVar191._12_4_ = 2;
          auVar191._16_4_ = 2;
          auVar191._20_4_ = 2;
          auVar191._24_4_ = 2;
          auVar191._28_4_ = 2;
          auVar42._8_4_ = 3;
          auVar42._0_8_ = 0x300000003;
          auVar42._12_4_ = 3;
          auVar42._16_4_ = 3;
          auVar42._20_4_ = 3;
          auVar42._24_4_ = 3;
          auVar42._28_4_ = 3;
          auVar116 = vpblendmd_avx512vl(auVar191,auVar42);
          local_880._0_4_ = (uint)(bVar96 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar96 & 1) * 2;
          bVar7 = (bool)(bVar96 >> 1 & 1);
          local_880._4_4_ = (uint)bVar7 * auVar116._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar96 >> 2 & 1);
          fStack_878 = (float)((uint)bVar7 * auVar116._8_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar96 >> 3 & 1);
          fStack_874 = (float)((uint)bVar7 * auVar116._12_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar96 >> 4 & 1);
          fStack_870 = (float)((uint)bVar7 * auVar116._16_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar96 >> 5 & 1);
          fStack_86c = (float)((uint)bVar7 * auVar116._20_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar96 >> 6 & 1);
          fStack_868 = (float)((uint)bVar7 * auVar116._24_4_ | (uint)!bVar7 * 2);
          fStack_864 = (float)((uint)(bVar96 >> 7) * auVar116._28_4_ |
                              (uint)!(bool)(bVar96 >> 7) * 2);
          auVar194._0_32_ = _local_880;
          uVar23 = vpcmpd_avx512vl(_local_880,local_800,2);
          bVar96 = (byte)uVar23 & bVar88;
          if (bVar96 != 0) {
            auVar106 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar105 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar102 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar107 = vminps_avx(auVar106,auVar102);
            auVar106 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar102 = vmaxps_avx(auVar105,auVar106);
            auVar105 = vandps_avx(auVar268,auVar107);
            auVar106 = vandps_avx(auVar268,auVar102);
            auVar105 = vmaxps_avx(auVar105,auVar106);
            auVar106 = vmovshdup_avx(auVar105);
            auVar106 = vmaxss_avx(auVar106,auVar105);
            auVar105 = vshufpd_avx(auVar105,auVar105,1);
            auVar105 = vmaxss_avx(auVar105,auVar106);
            fVar173 = auVar105._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar102,auVar102,0xff);
            _local_920 = _local_7c0;
            local_860 = (float)local_7c0._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_7c0._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_7b8 + fStack_8f8;
            fStack_854 = fStack_7b4 + fStack_8f4;
            fStack_850 = fStack_7b0 + fStack_8f0;
            fStack_84c = fStack_7ac + fStack_8ec;
            fStack_848 = fStack_7a8 + fStack_8e8;
            fStack_844 = fStack_7a4 + fStack_8e4;
            do {
              auVar192._8_4_ = 0x7f800000;
              auVar192._0_8_ = 0x7f8000007f800000;
              auVar192._12_4_ = 0x7f800000;
              auVar192._16_4_ = 0x7f800000;
              auVar192._20_4_ = 0x7f800000;
              auVar192._24_4_ = 0x7f800000;
              auVar192._28_4_ = 0x7f800000;
              auVar116 = vblendmps_avx512vl(auVar192,_local_920);
              auVar154._0_4_ =
                   (uint)(bVar96 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar96 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar96 >> 1 & 1);
              auVar154._4_4_ = (uint)bVar7 * auVar116._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar96 >> 2 & 1);
              auVar154._8_4_ = (uint)bVar7 * auVar116._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar96 >> 3 & 1);
              auVar154._12_4_ = (uint)bVar7 * auVar116._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar96 >> 4 & 1);
              auVar154._16_4_ = (uint)bVar7 * auVar116._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar96 >> 5 & 1);
              auVar154._20_4_ = (uint)bVar7 * auVar116._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar154._24_4_ =
                   (uint)(bVar96 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar96 >> 6) * 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar194._0_32_ = auVar154;
              auVar116 = vshufps_avx(auVar154,auVar154,0xb1);
              auVar116 = vminps_avx(auVar154,auVar116);
              auVar119 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar119);
              auVar119 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar119);
              uVar23 = vcmpps_avx512vl(auVar154,auVar116,0);
              bVar90 = (byte)uVar23 & bVar96;
              bVar95 = bVar96;
              if (bVar90 != 0) {
                bVar95 = bVar90;
              }
              iVar26 = 0;
              for (uVar94 = (uint)bVar95; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar26 = iVar26 + 1;
              }
              fVar257 = *(float *)(local_840 + (uint)(iVar26 << 2));
              fVar258 = *(float *)(local_7a0 + (uint)(iVar26 << 2));
              fVar260 = auVar104._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_a30._0_4_);
              }
              lVar99 = 4;
              do {
                auVar178._4_4_ = fVar258;
                auVar178._0_4_ = fVar258;
                auVar178._8_4_ = fVar258;
                auVar178._12_4_ = fVar258;
                auVar106 = vfmadd132ps_fma(auVar178,ZEXT816(0) << 0x40,local_a20);
                fVar267 = 1.0 - fVar257;
                auVar226._0_4_ = local_980._0_4_ * fVar257;
                auVar226._4_4_ = local_980._4_4_ * fVar257;
                auVar226._8_4_ = local_980._8_4_ * fVar257;
                auVar226._12_4_ = local_980._12_4_ * fVar257;
                local_9b0 = ZEXT416((uint)fVar267);
                auVar241._4_4_ = fVar267;
                auVar241._0_4_ = fVar267;
                auVar241._8_4_ = fVar267;
                auVar241._12_4_ = fVar267;
                auVar105 = vfmadd231ps_fma(auVar226,auVar241,local_940._0_16_);
                auVar247._0_4_ = local_960._0_4_ * fVar257;
                auVar247._4_4_ = local_960._4_4_ * fVar257;
                auVar247._8_4_ = local_960._8_4_ * fVar257;
                auVar247._12_4_ = local_960._12_4_ * fVar257;
                auVar102 = vfmadd231ps_fma(auVar247,auVar241,local_980._0_16_);
                auVar252._0_4_ = fVar257 * (float)local_9a0._0_4_;
                auVar252._4_4_ = fVar257 * (float)local_9a0._4_4_;
                auVar252._8_4_ = fVar257 * fStack_998;
                auVar252._12_4_ = fVar257 * fStack_994;
                auVar107 = vfmadd231ps_fma(auVar252,auVar241,local_960._0_16_);
                auVar255._0_4_ = fVar257 * auVar102._0_4_;
                auVar255._4_4_ = fVar257 * auVar102._4_4_;
                auVar255._8_4_ = fVar257 * auVar102._8_4_;
                auVar255._12_4_ = fVar257 * auVar102._12_4_;
                auVar105 = vfmadd231ps_fma(auVar255,auVar241,auVar105);
                auVar227._0_4_ = fVar257 * auVar107._0_4_;
                auVar227._4_4_ = fVar257 * auVar107._4_4_;
                auVar227._8_4_ = fVar257 * auVar107._8_4_;
                auVar227._12_4_ = fVar257 * auVar107._12_4_;
                auVar102 = vfmadd231ps_fma(auVar227,auVar241,auVar102);
                auVar248._0_4_ = fVar257 * auVar102._0_4_;
                auVar248._4_4_ = fVar257 * auVar102._4_4_;
                auVar248._8_4_ = fVar257 * auVar102._8_4_;
                auVar248._12_4_ = fVar257 * auVar102._12_4_;
                auVar107 = vfmadd231ps_fma(auVar248,auVar105,auVar241);
                auVar105 = vsubps_avx(auVar102,auVar105);
                auVar30._8_4_ = 0x40400000;
                auVar30._0_8_ = 0x4040000040400000;
                auVar30._12_4_ = 0x40400000;
                auVar116 = auVar194._32_32_;
                auVar102 = vmulps_avx512vl(auVar105,auVar30);
                local_8e0._0_16_ = auVar107;
                auVar105 = vsubps_avx(auVar106,auVar107);
                local_a60._0_16_ = auVar105;
                auVar105 = vdpps_avx(auVar105,auVar105,0x7f);
                local_a80._0_16_ = auVar105;
                local_bc0 = ZEXT416((uint)fVar257);
                if (auVar105._0_4_ < 0.0) {
                  auVar195._0_4_ = sqrtf(auVar105._0_4_);
                  auVar195._4_60_ = extraout_var_01;
                  auVar105 = auVar195._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                }
                local_9c0 = vdpps_avx(auVar102,auVar102,0x7f);
                fVar267 = local_9c0._0_4_;
                auVar228._4_12_ = ZEXT812(0) << 0x20;
                auVar228._0_4_ = fVar267;
                auVar106 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
                fVar197 = auVar106._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(local_9c0,auVar31);
                auVar106 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar94 = auVar105._0_4_;
                if (fVar267 < auVar107._0_4_) {
                  auVar196._0_4_ = sqrtf(fVar267);
                  auVar196._4_60_ = extraout_var_02;
                  auVar105 = ZEXT416(uVar94);
                  auVar107 = auVar196._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar267 = fVar197 * 1.5 + fVar267 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar179._0_4_ = auVar102._0_4_ * fVar267;
                auVar179._4_4_ = auVar102._4_4_ * fVar267;
                auVar179._8_4_ = auVar102._8_4_ * fVar267;
                auVar179._12_4_ = auVar102._12_4_ * fVar267;
                auVar2 = vdpps_avx(local_a60._0_16_,auVar179,0x7f);
                fVar237 = auVar105._0_4_;
                fVar197 = auVar2._0_4_;
                auVar180._0_4_ = fVar197 * fVar197;
                auVar180._4_4_ = auVar2._4_4_ * auVar2._4_4_;
                auVar180._8_4_ = auVar2._8_4_ * auVar2._8_4_;
                auVar180._12_4_ = auVar2._12_4_ * auVar2._12_4_;
                auVar108 = vsubps_avx512vl(local_a80._0_16_,auVar180);
                fVar262 = auVar108._0_4_;
                auVar205._4_12_ = ZEXT812(0) << 0x20;
                auVar205._0_4_ = fVar262;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar205);
                auVar109 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar110 = vmulss_avx512f(auVar108,ZEXT416(0xbf000000));
                if (fVar262 < 0.0) {
                  local_9f0 = fVar267;
                  fStack_9ec = fVar267;
                  fStack_9e8 = fVar267;
                  fStack_9e4 = fVar267;
                  local_9e0 = auVar103;
                  fVar262 = sqrtf(fVar262);
                  auVar110 = ZEXT416(auVar110._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar105 = ZEXT416(uVar94);
                  auVar103 = local_9e0;
                  fVar267 = local_9f0;
                  fVar263 = fStack_9ec;
                  fVar259 = fStack_9e8;
                  fVar261 = fStack_9e4;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  fVar262 = auVar108._0_4_;
                  fVar263 = fVar267;
                  fVar259 = fVar267;
                  fVar261 = fVar267;
                }
                auVar266._8_4_ = 0x7fffffff;
                auVar266._0_8_ = 0x7fffffff7fffffff;
                auVar266._12_4_ = 0x7fffffff;
                auVar163._32_32_ = auVar116;
                auVar163._0_32_ = local_aa0;
                auVar273 = ZEXT3264(local_aa0);
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar198 = auVar108._0_4_ * 6.0;
                fVar22 = fVar257 * 6.0;
                auVar229._0_4_ = fVar22 * (float)local_9a0._0_4_;
                auVar229._4_4_ = fVar22 * (float)local_9a0._4_4_;
                auVar229._8_4_ = fVar22 * fStack_998;
                auVar229._12_4_ = fVar22 * fStack_994;
                auVar206._4_4_ = fVar198;
                auVar206._0_4_ = fVar198;
                auVar206._8_4_ = fVar198;
                auVar206._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar206,auVar229,local_960._0_16_);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar198 = auVar112._0_4_ * 6.0;
                auVar230._4_4_ = fVar198;
                auVar230._0_4_ = fVar198;
                auVar230._8_4_ = fVar198;
                auVar230._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar230,auVar108,local_980._0_16_);
                fVar198 = local_9b0._0_4_ * 6.0;
                auVar207._4_4_ = fVar198;
                auVar207._0_4_ = fVar198;
                auVar207._8_4_ = fVar198;
                auVar207._12_4_ = fVar198;
                auVar108 = vfmadd132ps_fma(auVar207,auVar108,local_940._0_16_);
                auVar231._0_4_ = auVar108._0_4_ * (float)local_9c0._0_4_;
                auVar231._4_4_ = auVar108._4_4_ * (float)local_9c0._0_4_;
                auVar231._8_4_ = auVar108._8_4_ * (float)local_9c0._0_4_;
                auVar231._12_4_ = auVar108._12_4_ * (float)local_9c0._0_4_;
                auVar108 = vdpps_avx(auVar102,auVar108,0x7f);
                fVar198 = auVar108._0_4_;
                auVar208._0_4_ = auVar102._0_4_ * fVar198;
                auVar208._4_4_ = auVar102._4_4_ * fVar198;
                auVar208._8_4_ = auVar102._8_4_ * fVar198;
                auVar208._12_4_ = auVar102._12_4_ * fVar198;
                auVar108 = vsubps_avx(auVar231,auVar208);
                fVar198 = auVar106._0_4_ * (float)local_9d0._0_4_;
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar194._16_48_ = auVar163._16_48_;
                auVar111 = vxorps_avx512vl(auVar102,auVar32);
                auVar249._0_4_ = fVar267 * auVar108._0_4_ * fVar198;
                auVar249._4_4_ = fVar263 * auVar108._4_4_ * fVar198;
                auVar249._8_4_ = fVar259 * auVar108._8_4_ * fVar198;
                auVar249._12_4_ = fVar261 * auVar108._12_4_ * fVar198;
                auVar106 = vdpps_avx(auVar111,auVar179,0x7f);
                auVar108 = vmaxss_avx(ZEXT416((uint)fVar173),
                                      ZEXT416((uint)(fVar258 * fVar260 * 1.9073486e-06)));
                auVar112 = vdivss_avx512f(ZEXT416((uint)fVar173),auVar107);
                auVar107 = vdpps_avx(local_a60._0_16_,auVar249,0x7f);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar173),auVar108);
                auVar112 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),auVar112,auVar105);
                auVar105 = vdpps_avx(local_a20,auVar179,0x7f);
                fVar267 = auVar106._0_4_ + auVar107._0_4_;
                auVar106 = vdpps_avx(local_a60._0_16_,auVar111,0x7f);
                auVar110 = vmulss_avx512f(auVar110,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar107 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar194._0_16_ =
                     vaddss_avx512f(auVar109,ZEXT416((uint)(auVar110._0_4_ * auVar103._0_4_)));
                auVar103 = vfnmadd231ss_fma(auVar106,auVar2,ZEXT416((uint)fVar267));
                auVar109 = vfnmadd231ss_fma(auVar107,auVar2,auVar105);
                auVar106 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar262 = fVar262 - auVar106._0_4_;
                auVar106 = vshufps_avx(auVar102,auVar102,0xff);
                auVar107 = vfmsub213ss_fma(auVar103,auVar194._0_16_,auVar106);
                fVar237 = auVar109._0_4_ * auVar194._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar107._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar237));
                fVar263 = auVar103._0_4_;
                fVar267 = fVar262 * (fVar267 / fVar263) - fVar197 * (auVar107._0_4_ / fVar263);
                auVar250 = ZEXT464((uint)fVar267);
                fVar257 = fVar257 - (fVar197 * (fVar237 / fVar263) -
                                    fVar262 * (auVar105._0_4_ / fVar263));
                fVar258 = fVar258 - fVar267;
                auVar105 = vandps_avx(auVar2,auVar266);
                if (auVar112._0_4_ <= auVar105._0_4_) {
LAB_01d13a49:
                  bVar7 = false;
                }
                else {
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar112._0_4_ + auVar108._0_4_)),
                                             local_a10,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(auVar266,ZEXT416((uint)fVar262));
                  if (auVar107._0_4_ <= auVar105._0_4_) goto LAB_01d13a49;
                  fVar258 = fVar258 + (float)local_a00._0_4_;
                  bVar7 = true;
                  if (fVar238 <= fVar258) {
                    fVar267 = *(float *)(ray + k * 4 + 0x200);
                    auVar250 = ZEXT464((uint)fVar267);
                    if (((fVar258 <= fVar267) && (0.0 <= fVar257)) && (fVar257 <= 1.0)) {
                      auVar165._16_48_ = auVar194._16_48_;
                      auVar165._0_16_ = ZEXT816(0) << 0x20;
                      auVar164._4_60_ = auVar165._4_60_;
                      auVar164._0_4_ = local_a80._0_4_;
                      auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar164._0_16_);
                      fVar197 = auVar105._0_4_;
                      auVar194._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar98].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar197 = fVar197 * 1.5 + auVar194._0_4_ * fVar197 * fVar197 * fVar197;
                        auVar209._0_4_ = local_a60._0_4_ * fVar197;
                        auVar209._4_4_ = local_a60._4_4_ * fVar197;
                        auVar209._8_4_ = local_a60._8_4_ * fVar197;
                        auVar209._12_4_ = local_a60._12_4_ * fVar197;
                        auVar107 = vfmadd213ps_fma(auVar106,auVar209,auVar102);
                        auVar105 = vshufps_avx(auVar209,auVar209,0xc9);
                        auVar106 = vshufps_avx(auVar102,auVar102,0xc9);
                        auVar210._0_4_ = auVar209._0_4_ * auVar106._0_4_;
                        auVar210._4_4_ = auVar209._4_4_ * auVar106._4_4_;
                        auVar210._8_4_ = auVar209._8_4_ * auVar106._8_4_;
                        auVar210._12_4_ = auVar209._12_4_ * auVar106._12_4_;
                        auVar102 = vfmsub231ps_fma(auVar210,auVar102,auVar105);
                        auVar105 = vshufps_avx(auVar102,auVar102,0xc9);
                        auVar106 = vshufps_avx(auVar107,auVar107,0xc9);
                        auVar102 = vshufps_avx(auVar102,auVar102,0xd2);
                        auVar181._0_4_ = auVar107._0_4_ * auVar102._0_4_;
                        auVar181._4_4_ = auVar107._4_4_ * auVar102._4_4_;
                        auVar181._8_4_ = auVar107._8_4_ * auVar102._8_4_;
                        auVar181._12_4_ = auVar107._12_4_ * auVar102._12_4_;
                        auVar105 = vfmsub231ps_fma(auVar181,auVar105,auVar106);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          uVar239 = vextractps_avx(auVar105,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar239;
                          uVar239 = vextractps_avx(auVar105,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar239;
                          *(int *)(ray + k * 4 + 0x380) = auVar105._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar257;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(undefined4 *)(ray + k * 4 + 0x440) = uVar1;
                          *(uint *)(ray + k * 4 + 0x480) = uVar98;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar5 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar257));
                          auVar194 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar194 = vpermps_avx512f(auVar194,ZEXT1664(auVar105));
                          auVar157 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar157,ZEXT1664(auVar105));
                          local_380 = vbroadcastss_avx512f(auVar105);
                          local_400[0] = (RTCHitN)auVar194[0];
                          local_400[1] = (RTCHitN)auVar194[1];
                          local_400[2] = (RTCHitN)auVar194[2];
                          local_400[3] = (RTCHitN)auVar194[3];
                          local_400[4] = (RTCHitN)auVar194[4];
                          local_400[5] = (RTCHitN)auVar194[5];
                          local_400[6] = (RTCHitN)auVar194[6];
                          local_400[7] = (RTCHitN)auVar194[7];
                          local_400[8] = (RTCHitN)auVar194[8];
                          local_400[9] = (RTCHitN)auVar194[9];
                          local_400[10] = (RTCHitN)auVar194[10];
                          local_400[0xb] = (RTCHitN)auVar194[0xb];
                          local_400[0xc] = (RTCHitN)auVar194[0xc];
                          local_400[0xd] = (RTCHitN)auVar194[0xd];
                          local_400[0xe] = (RTCHitN)auVar194[0xe];
                          local_400[0xf] = (RTCHitN)auVar194[0xf];
                          local_400[0x10] = (RTCHitN)auVar194[0x10];
                          local_400[0x11] = (RTCHitN)auVar194[0x11];
                          local_400[0x12] = (RTCHitN)auVar194[0x12];
                          local_400[0x13] = (RTCHitN)auVar194[0x13];
                          local_400[0x14] = (RTCHitN)auVar194[0x14];
                          local_400[0x15] = (RTCHitN)auVar194[0x15];
                          local_400[0x16] = (RTCHitN)auVar194[0x16];
                          local_400[0x17] = (RTCHitN)auVar194[0x17];
                          local_400[0x18] = (RTCHitN)auVar194[0x18];
                          local_400[0x19] = (RTCHitN)auVar194[0x19];
                          local_400[0x1a] = (RTCHitN)auVar194[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar194[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar194[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar194[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar194[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar194[0x1f];
                          local_400[0x20] = (RTCHitN)auVar194[0x20];
                          local_400[0x21] = (RTCHitN)auVar194[0x21];
                          local_400[0x22] = (RTCHitN)auVar194[0x22];
                          local_400[0x23] = (RTCHitN)auVar194[0x23];
                          local_400[0x24] = (RTCHitN)auVar194[0x24];
                          local_400[0x25] = (RTCHitN)auVar194[0x25];
                          local_400[0x26] = (RTCHitN)auVar194[0x26];
                          local_400[0x27] = (RTCHitN)auVar194[0x27];
                          local_400[0x28] = (RTCHitN)auVar194[0x28];
                          local_400[0x29] = (RTCHitN)auVar194[0x29];
                          local_400[0x2a] = (RTCHitN)auVar194[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar194[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar194[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar194[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar194[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar194[0x2f];
                          local_400[0x30] = (RTCHitN)auVar194[0x30];
                          local_400[0x31] = (RTCHitN)auVar194[0x31];
                          local_400[0x32] = (RTCHitN)auVar194[0x32];
                          local_400[0x33] = (RTCHitN)auVar194[0x33];
                          local_400[0x34] = (RTCHitN)auVar194[0x34];
                          local_400[0x35] = (RTCHitN)auVar194[0x35];
                          local_400[0x36] = (RTCHitN)auVar194[0x36];
                          local_400[0x37] = (RTCHitN)auVar194[0x37];
                          local_400[0x38] = (RTCHitN)auVar194[0x38];
                          local_400[0x39] = (RTCHitN)auVar194[0x39];
                          local_400[0x3a] = (RTCHitN)auVar194[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar194[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar194[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar194[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar194[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar194[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar194 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar194);
                          auVar116 = vpcmpeqd_avx2(auVar194._0_32_,auVar194._0_32_);
                          local_ad0[3] = auVar116;
                          local_ad0[2] = auVar116;
                          local_ad0[1] = auVar116;
                          *local_ad0 = auVar116;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar4->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_b10);
                            auVar273 = ZEXT3264(local_aa0);
                          }
                          auVar194 = vmovdqa64_avx512f(local_8c0);
                          uVar23 = vptestmd_avx512f(auVar194,auVar194);
                          if ((short)uVar23 == 0) {
LAB_01d13d0d:
                            *(float *)(ray + k * 4 + 0x200) = fVar267;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_b10);
                              auVar273 = ZEXT3264(local_aa0);
                            }
                            auVar194 = vmovdqa64_avx512f(local_8c0);
                            uVar101 = vptestmd_avx512f(auVar194,auVar194);
                            if ((short)uVar101 == 0) goto LAB_01d13d0d;
                            iVar67 = *(int *)(local_b10.hit + 4);
                            iVar68 = *(int *)(local_b10.hit + 8);
                            iVar69 = *(int *)(local_b10.hit + 0xc);
                            iVar70 = *(int *)(local_b10.hit + 0x10);
                            iVar71 = *(int *)(local_b10.hit + 0x14);
                            iVar72 = *(int *)(local_b10.hit + 0x18);
                            iVar73 = *(int *)(local_b10.hit + 0x1c);
                            iVar74 = *(int *)(local_b10.hit + 0x20);
                            iVar75 = *(int *)(local_b10.hit + 0x24);
                            iVar76 = *(int *)(local_b10.hit + 0x28);
                            iVar77 = *(int *)(local_b10.hit + 0x2c);
                            iVar78 = *(int *)(local_b10.hit + 0x30);
                            iVar79 = *(int *)(local_b10.hit + 0x34);
                            iVar80 = *(int *)(local_b10.hit + 0x38);
                            iVar81 = *(int *)(local_b10.hit + 0x3c);
                            bVar95 = (byte)uVar101;
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar90 = (byte)(uVar101 >> 8);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar95 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x33c);
                            iVar67 = *(int *)(local_b10.hit + 0x44);
                            iVar68 = *(int *)(local_b10.hit + 0x48);
                            iVar69 = *(int *)(local_b10.hit + 0x4c);
                            iVar70 = *(int *)(local_b10.hit + 0x50);
                            iVar71 = *(int *)(local_b10.hit + 0x54);
                            iVar72 = *(int *)(local_b10.hit + 0x58);
                            iVar73 = *(int *)(local_b10.hit + 0x5c);
                            iVar74 = *(int *)(local_b10.hit + 0x60);
                            iVar75 = *(int *)(local_b10.hit + 100);
                            iVar76 = *(int *)(local_b10.hit + 0x68);
                            iVar77 = *(int *)(local_b10.hit + 0x6c);
                            iVar78 = *(int *)(local_b10.hit + 0x70);
                            iVar79 = *(int *)(local_b10.hit + 0x74);
                            iVar80 = *(int *)(local_b10.hit + 0x78);
                            iVar81 = *(int *)(local_b10.hit + 0x7c);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar95 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x37c);
                            iVar67 = *(int *)(local_b10.hit + 0x84);
                            iVar68 = *(int *)(local_b10.hit + 0x88);
                            iVar69 = *(int *)(local_b10.hit + 0x8c);
                            iVar70 = *(int *)(local_b10.hit + 0x90);
                            iVar71 = *(int *)(local_b10.hit + 0x94);
                            iVar72 = *(int *)(local_b10.hit + 0x98);
                            iVar73 = *(int *)(local_b10.hit + 0x9c);
                            iVar74 = *(int *)(local_b10.hit + 0xa0);
                            iVar75 = *(int *)(local_b10.hit + 0xa4);
                            iVar76 = *(int *)(local_b10.hit + 0xa8);
                            iVar77 = *(int *)(local_b10.hit + 0xac);
                            iVar78 = *(int *)(local_b10.hit + 0xb0);
                            iVar79 = *(int *)(local_b10.hit + 0xb4);
                            iVar80 = *(int *)(local_b10.hit + 0xb8);
                            iVar81 = *(int *)(local_b10.hit + 0xbc);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar95 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3bc);
                            iVar67 = *(int *)(local_b10.hit + 0xc4);
                            iVar68 = *(int *)(local_b10.hit + 200);
                            iVar69 = *(int *)(local_b10.hit + 0xcc);
                            iVar70 = *(int *)(local_b10.hit + 0xd0);
                            iVar71 = *(int *)(local_b10.hit + 0xd4);
                            iVar72 = *(int *)(local_b10.hit + 0xd8);
                            iVar73 = *(int *)(local_b10.hit + 0xdc);
                            iVar74 = *(int *)(local_b10.hit + 0xe0);
                            iVar75 = *(int *)(local_b10.hit + 0xe4);
                            iVar76 = *(int *)(local_b10.hit + 0xe8);
                            iVar77 = *(int *)(local_b10.hit + 0xec);
                            iVar78 = *(int *)(local_b10.hit + 0xf0);
                            iVar79 = *(int *)(local_b10.hit + 0xf4);
                            iVar80 = *(int *)(local_b10.hit + 0xf8);
                            iVar81 = *(int *)(local_b10.hit + 0xfc);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar95 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3fc);
                            iVar67 = *(int *)(local_b10.hit + 0x104);
                            iVar68 = *(int *)(local_b10.hit + 0x108);
                            iVar69 = *(int *)(local_b10.hit + 0x10c);
                            iVar70 = *(int *)(local_b10.hit + 0x110);
                            iVar71 = *(int *)(local_b10.hit + 0x114);
                            iVar72 = *(int *)(local_b10.hit + 0x118);
                            iVar73 = *(int *)(local_b10.hit + 0x11c);
                            iVar74 = *(int *)(local_b10.hit + 0x120);
                            iVar75 = *(int *)(local_b10.hit + 0x124);
                            iVar76 = *(int *)(local_b10.hit + 0x128);
                            iVar77 = *(int *)(local_b10.hit + 300);
                            iVar78 = *(int *)(local_b10.hit + 0x130);
                            iVar79 = *(int *)(local_b10.hit + 0x134);
                            iVar80 = *(int *)(local_b10.hit + 0x138);
                            iVar81 = *(int *)(local_b10.hit + 0x13c);
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar101 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar101 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar101 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar101 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar101 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar101 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar101 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar101 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            bVar20 = SUB81(uVar101 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar95 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar100 * iVar67 |
                                 (uint)!bVar100 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x43c);
                            auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar194 = vmovdqu32_avx512f(auVar194);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar194;
                            auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar194 = vmovdqu32_avx512f(auVar194);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar194;
                            auVar157 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar194 = vmovdqa32_avx512f(auVar157);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar194;
                            auVar236 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar100 = (bool)((byte)(uVar101 >> 1) & 1);
                            auVar65._4_56_ = auVar236._8_56_;
                            auVar65._0_4_ =
                                 (uint)bVar100 * auVar236._4_4_ | (uint)!bVar100 * auVar157._4_4_;
                            auVar194._0_8_ = auVar65._0_8_ << 0x20;
                            bVar100 = (bool)((byte)(uVar101 >> 2) & 1);
                            auVar194._8_4_ =
                                 (uint)bVar100 * auVar236._8_4_ | (uint)!bVar100 * auVar157._8_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 3) & 1);
                            auVar194._12_4_ =
                                 (uint)bVar100 * auVar236._12_4_ | (uint)!bVar100 * auVar157._12_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 4) & 1);
                            auVar194._16_4_ =
                                 (uint)bVar100 * auVar236._16_4_ | (uint)!bVar100 * auVar157._16_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 5) & 1);
                            auVar194._20_4_ =
                                 (uint)bVar100 * auVar236._20_4_ | (uint)!bVar100 * auVar157._20_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 6) & 1);
                            auVar194._24_4_ =
                                 (uint)bVar100 * auVar236._24_4_ | (uint)!bVar100 * auVar157._24_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 7) & 1);
                            auVar194._28_4_ =
                                 (uint)bVar100 * auVar236._28_4_ | (uint)!bVar100 * auVar157._28_4_;
                            auVar194._32_4_ =
                                 (uint)(bVar90 & 1) * auVar236._32_4_ |
                                 (uint)!(bool)(bVar90 & 1) * auVar157._32_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 9) & 1);
                            auVar194._36_4_ =
                                 (uint)bVar100 * auVar236._36_4_ | (uint)!bVar100 * auVar157._36_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 10) & 1);
                            auVar194._40_4_ =
                                 (uint)bVar100 * auVar236._40_4_ | (uint)!bVar100 * auVar157._40_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            auVar194._44_4_ =
                                 (uint)bVar100 * auVar236._44_4_ | (uint)!bVar100 * auVar157._44_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            auVar194._48_4_ =
                                 (uint)bVar100 * auVar236._48_4_ | (uint)!bVar100 * auVar157._48_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            auVar194._52_4_ =
                                 (uint)bVar100 * auVar236._52_4_ | (uint)!bVar100 * auVar157._52_4_;
                            bVar100 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            auVar194._56_4_ =
                                 (uint)bVar100 * auVar236._56_4_ | (uint)!bVar100 * auVar157._56_4_;
                            bVar100 = SUB81(uVar101 >> 0xf,0);
                            auVar194._60_4_ =
                                 (uint)bVar100 * auVar236._60_4_ | (uint)!bVar100 * auVar157._60_4_;
                            auVar157 = vmovdqa32_avx512f(auVar236);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar157;
                          }
                          auVar250 = ZEXT464((uint)fVar267);
                        }
                      }
                    }
                  }
                }
                bVar100 = lVar99 != 0;
                lVar99 = lVar99 + -1;
              } while ((!bVar7) && (bVar100));
              auVar83._4_4_ = fStack_85c;
              auVar83._0_4_ = local_860;
              auVar83._8_4_ = fStack_858;
              auVar83._12_4_ = fStack_854;
              auVar83._16_4_ = fStack_850;
              auVar83._20_4_ = fStack_84c;
              auVar83._24_4_ = fStack_848;
              auVar83._28_4_ = fStack_844;
              uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar43._4_4_ = uVar239;
              auVar43._0_4_ = uVar239;
              auVar43._8_4_ = uVar239;
              auVar43._12_4_ = uVar239;
              auVar43._16_4_ = uVar239;
              auVar43._20_4_ = uVar239;
              auVar43._24_4_ = uVar239;
              auVar43._28_4_ = uVar239;
              uVar23 = vcmpps_avx512vl(auVar83,auVar43,2);
              bVar96 = ~('\x01' << ((byte)iVar26 & 0x1f)) & bVar96 & (byte)uVar23;
            } while (bVar96 != 0);
          }
          uVar25 = vpcmpd_avx512vl(local_800,_local_880,1);
          uVar24 = vpcmpd_avx512vl(local_800,local_780,1);
          auVar215._0_4_ = (float)local_900._0_4_ + (float)local_500._0_4_;
          auVar215._4_4_ = (float)local_900._4_4_ + (float)local_500._4_4_;
          auVar215._8_4_ = fStack_8f8 + fStack_4f8;
          auVar215._12_4_ = fStack_8f4 + fStack_4f4;
          auVar215._16_4_ = fStack_8f0 + fStack_4f0;
          auVar215._20_4_ = fStack_8ec + fStack_4ec;
          auVar215._24_4_ = fStack_8e8 + fStack_4e8;
          auVar215._28_4_ = fStack_8e4 + fStack_4e4;
          uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar235._4_4_ = uVar239;
          auVar235._0_4_ = uVar239;
          auVar235._8_4_ = uVar239;
          auVar235._12_4_ = uVar239;
          auVar235._16_4_ = uVar239;
          auVar235._20_4_ = uVar239;
          auVar235._24_4_ = uVar239;
          auVar235._28_4_ = uVar239;
          uVar23 = vcmpps_avx512vl(auVar215,auVar235,2);
          bVar91 = bVar91 & (byte)uVar24 & (byte)uVar23;
          auVar242._0_4_ = (float)local_900._0_4_ + local_7c0._0_4_;
          auVar242._4_4_ = (float)local_900._4_4_ + local_7c0._4_4_;
          auVar242._8_4_ = fStack_8f8 + local_7c0._8_4_;
          auVar242._12_4_ = fStack_8f4 + local_7c0._12_4_;
          auVar242._16_4_ = fStack_8f0 + local_7c0._16_4_;
          auVar242._20_4_ = fStack_8ec + local_7c0._20_4_;
          auVar242._24_4_ = fStack_8e8 + local_7c0._24_4_;
          auVar242._28_4_ = fStack_8e4 + local_7c0._28_4_;
          uVar23 = vcmpps_avx512vl(auVar242,auVar235,2);
          bVar88 = bVar88 & (byte)uVar25 & (byte)uVar23 | bVar91;
          prim = local_ac0;
          pPVar97 = local_ac8;
          if (bVar88 == 0) {
            auVar243 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar101 = local_ab0 & 0xffffffff;
            abStack_1a0[uVar101 * 0x60] = bVar88;
            auVar155._0_4_ =
                 (uint)(bVar91 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar91 & 1) * (int)local_7c0._0_4_;
            bVar7 = (bool)(bVar91 >> 1 & 1);
            auVar155._4_4_ = (uint)bVar7 * local_500._4_4_ | (uint)!bVar7 * (int)local_7c0._4_4_;
            bVar7 = (bool)(bVar91 >> 2 & 1);
            auVar155._8_4_ = (uint)bVar7 * (int)fStack_4f8 | (uint)!bVar7 * (int)local_7c0._8_4_;
            bVar7 = (bool)(bVar91 >> 3 & 1);
            auVar155._12_4_ = (uint)bVar7 * (int)fStack_4f4 | (uint)!bVar7 * (int)local_7c0._12_4_;
            bVar7 = (bool)(bVar91 >> 4 & 1);
            auVar155._16_4_ = (uint)bVar7 * (int)fStack_4f0 | (uint)!bVar7 * (int)local_7c0._16_4_;
            bVar7 = (bool)(bVar91 >> 5 & 1);
            auVar155._20_4_ = (uint)bVar7 * (int)fStack_4ec | (uint)!bVar7 * (int)local_7c0._20_4_;
            auVar155._24_4_ =
                 (uint)(bVar91 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar91 >> 6) * (int)local_7c0._24_4_;
            auVar155._28_4_ = local_7c0._28_4_;
            auVar194._0_32_ = auVar155;
            *(undefined1 (*) [32])(auStack_180 + uVar101 * 0x60) = auVar155;
            uVar23 = vmovlps_avx(local_ae0);
            *(undefined8 *)(afStack_160 + uVar101 * 0x18) = uVar23;
            auStack_158[uVar101 * 0x18] = (int)local_ab8 + 1;
            local_ab0 = (ulong)((int)local_ab0 + 1);
            auVar243 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar236 = ZEXT1664(local_ae0);
    local_ab0 = local_ab0 & 0xffffffff;
    do {
      if ((int)local_ab0 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar45._4_4_ = uVar1;
        auVar45._0_4_ = uVar1;
        auVar45._8_4_ = uVar1;
        auVar45._12_4_ = uVar1;
        auVar45._16_4_ = uVar1;
        auVar45._20_4_ = uVar1;
        auVar45._24_4_ = uVar1;
        auVar45._28_4_ = uVar1;
        uVar23 = vcmpps_avx512vl(local_760,auVar45,2);
        uVar98 = (uint)local_aa8 & (uint)uVar23;
        local_aa8 = (ulong)uVar98;
        if (uVar98 == 0) {
          return;
        }
        goto LAB_01d11946;
      }
      uVar101 = (ulong)((int)local_ab0 - 1);
      lVar99 = uVar101 * 0x60;
      auVar116 = *(undefined1 (*) [32])(auStack_180 + lVar99);
      auVar216._0_4_ = auVar116._0_4_ + (float)local_900._0_4_;
      auVar216._4_4_ = auVar116._4_4_ + (float)local_900._4_4_;
      auVar216._8_4_ = auVar116._8_4_ + fStack_8f8;
      auVar216._12_4_ = auVar116._12_4_ + fStack_8f4;
      auVar216._16_4_ = auVar116._16_4_ + fStack_8f0;
      auVar216._20_4_ = auVar116._20_4_ + fStack_8ec;
      auVar216._24_4_ = auVar116._24_4_ + fStack_8e8;
      auVar216._28_4_ = auVar116._28_4_ + fStack_8e4;
      uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar44._4_4_ = uVar239;
      auVar44._0_4_ = uVar239;
      auVar44._8_4_ = uVar239;
      auVar44._12_4_ = uVar239;
      auVar44._16_4_ = uVar239;
      auVar44._20_4_ = uVar239;
      auVar44._24_4_ = uVar239;
      auVar44._28_4_ = uVar239;
      uVar23 = vcmpps_avx512vl(auVar216,auVar44,2);
      uVar94 = (uint)uVar23 & (uint)abStack_1a0[lVar99];
      bVar88 = (byte)uVar94;
      if (uVar94 != 0) {
        auVar217._8_4_ = 0x7f800000;
        auVar217._0_8_ = 0x7f8000007f800000;
        auVar217._12_4_ = 0x7f800000;
        auVar217._16_4_ = 0x7f800000;
        auVar217._20_4_ = 0x7f800000;
        auVar217._24_4_ = 0x7f800000;
        auVar217._28_4_ = 0x7f800000;
        auVar119 = vblendmps_avx512vl(auVar217,auVar116);
        auVar156._0_4_ =
             (uint)(bVar88 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)auVar116._0_4_;
        bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar156._4_4_ = (uint)bVar7 * auVar119._4_4_ | (uint)!bVar7 * (int)auVar116._4_4_;
        bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar156._8_4_ = (uint)bVar7 * auVar119._8_4_ | (uint)!bVar7 * (int)auVar116._8_4_;
        bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar156._12_4_ = (uint)bVar7 * auVar119._12_4_ | (uint)!bVar7 * (int)auVar116._12_4_;
        bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar156._16_4_ = (uint)bVar7 * auVar119._16_4_ | (uint)!bVar7 * (int)auVar116._16_4_;
        bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar156._20_4_ = (uint)bVar7 * auVar119._20_4_ | (uint)!bVar7 * (int)auVar116._20_4_;
        bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar156._24_4_ = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * (int)auVar116._24_4_;
        auVar156._28_4_ =
             (uVar94 >> 7) * auVar119._28_4_ | (uint)!SUB41(uVar94 >> 7,0) * (int)auVar116._28_4_;
        auVar194._0_32_ = auVar156;
        auVar116 = vshufps_avx(auVar156,auVar156,0xb1);
        auVar116 = vminps_avx(auVar156,auVar116);
        auVar119 = vshufpd_avx(auVar116,auVar116,5);
        auVar116 = vminps_avx(auVar116,auVar119);
        auVar119 = vpermpd_avx2(auVar116,0x4e);
        auVar116 = vminps_avx(auVar116,auVar119);
        uVar23 = vcmpps_avx512vl(auVar156,auVar116,0);
        bVar96 = (byte)uVar23 & bVar88;
        if (bVar96 != 0) {
          uVar94 = (uint)bVar96;
        }
        fVar173 = afStack_160[uVar101 * 0x18 + 1];
        uVar166 = 0;
        for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
          uVar166 = uVar166 + 1;
        }
        local_ab8 = (ulong)auStack_158[uVar101 * 0x18];
        bVar96 = ~('\x01' << ((byte)uVar166 & 0x1f)) & bVar88;
        abStack_1a0[lVar99] = bVar96;
        uVar92 = uVar101;
        if (bVar96 != 0) {
          uVar92 = local_ab0;
        }
        fVar257 = afStack_160[uVar101 * 0x18];
        auVar218._4_4_ = fVar257;
        auVar218._0_4_ = fVar257;
        auVar218._8_4_ = fVar257;
        auVar218._12_4_ = fVar257;
        auVar218._16_4_ = fVar257;
        auVar218._20_4_ = fVar257;
        auVar218._24_4_ = fVar257;
        auVar218._28_4_ = fVar257;
        fVar173 = fVar173 - fVar257;
        auVar193._4_4_ = fVar173;
        auVar193._0_4_ = fVar173;
        auVar193._8_4_ = fVar173;
        auVar193._12_4_ = fVar173;
        auVar193._16_4_ = fVar173;
        auVar193._20_4_ = fVar173;
        auVar193._24_4_ = fVar173;
        auVar193._28_4_ = fVar173;
        auVar105 = vfmadd132ps_fma(auVar193,auVar218,auVar243._0_32_);
        auVar116 = ZEXT1632(auVar105);
        local_400[0] = (RTCHitN)auVar116[0];
        local_400[1] = (RTCHitN)auVar116[1];
        local_400[2] = (RTCHitN)auVar116[2];
        local_400[3] = (RTCHitN)auVar116[3];
        local_400[4] = (RTCHitN)auVar116[4];
        local_400[5] = (RTCHitN)auVar116[5];
        local_400[6] = (RTCHitN)auVar116[6];
        local_400[7] = (RTCHitN)auVar116[7];
        local_400[8] = (RTCHitN)auVar116[8];
        local_400[9] = (RTCHitN)auVar116[9];
        local_400[10] = (RTCHitN)auVar116[10];
        local_400[0xb] = (RTCHitN)auVar116[0xb];
        local_400[0xc] = (RTCHitN)auVar116[0xc];
        local_400[0xd] = (RTCHitN)auVar116[0xd];
        local_400[0xe] = (RTCHitN)auVar116[0xe];
        local_400[0xf] = (RTCHitN)auVar116[0xf];
        local_400[0x10] = (RTCHitN)auVar116[0x10];
        local_400[0x11] = (RTCHitN)auVar116[0x11];
        local_400[0x12] = (RTCHitN)auVar116[0x12];
        local_400[0x13] = (RTCHitN)auVar116[0x13];
        local_400[0x14] = (RTCHitN)auVar116[0x14];
        local_400[0x15] = (RTCHitN)auVar116[0x15];
        local_400[0x16] = (RTCHitN)auVar116[0x16];
        local_400[0x17] = (RTCHitN)auVar116[0x17];
        local_400[0x18] = (RTCHitN)auVar116[0x18];
        local_400[0x19] = (RTCHitN)auVar116[0x19];
        local_400[0x1a] = (RTCHitN)auVar116[0x1a];
        local_400[0x1b] = (RTCHitN)auVar116[0x1b];
        local_400[0x1c] = (RTCHitN)auVar116[0x1c];
        local_400[0x1d] = (RTCHitN)auVar116[0x1d];
        local_400[0x1e] = (RTCHitN)auVar116[0x1e];
        local_400[0x1f] = (RTCHitN)auVar116[0x1f];
        auVar236 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar166 * 4));
        uVar101 = uVar92;
      }
      local_ab0 = uVar101;
    } while (bVar88 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }